

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-tx.cpp
# Opt level: O3

int CommandLineRawTx(int argc,char **argv)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  Txid hashPrevTx;
  CScript scriptPubKeyIn;
  CScript scriptPubKeyIn_00;
  CScript scriptPubKeyIn_01;
  CScript scriptPubKeyIn_02;
  CScript scriptPubKeyIn_03;
  CScript scriptSigIn;
  undefined7 uVar5;
  undefined1 auVar6 [16];
  pointer pCVar7;
  _Head_base<0UL,_ECC_Context_*,_false> _Var8;
  char cVar9;
  _Alloc_hider _Var10;
  bool bVar11;
  int iVar12;
  uint32_t uVar13;
  void *pvVar14;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  ECC_Context *pEVar15;
  byte *pbVar16;
  FILE *__stream;
  size_t sVar17;
  const_iterator cVar18;
  mapped_type *pmVar19;
  UniValue *pUVar20;
  UniValue *pUVar21;
  string *psVar22;
  Coin *pCVar23;
  CTxOut *txout;
  ulong uVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar26;
  undefined8 *puVar27;
  runtime_error *prVar28;
  ulong uVar29;
  _Alloc_hider _Var30;
  long lVar31;
  COutPoint *__comp;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  uint uVar33;
  ulong uVar34;
  uint uVar35;
  long *plVar36;
  allocator_type *in_R8;
  bool bVar37;
  pointer pcVar38;
  CTxIn *input;
  ulong uVar39;
  char *__data;
  size_type sVar40;
  pointer pCVar41;
  anon_struct_16_2_9739c62b *paVar42;
  size_t sVar43;
  size_type __n;
  long lVar44;
  CScript *pCVar45;
  long in_FS_OFFSET;
  undefined1 auVar46 [16];
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>
  __l;
  Span<const_unsigned_char> s;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view val;
  string_view separators;
  string_view separators_00;
  string_view separators_01;
  string_view separators_02;
  string_view separators_03;
  _Alloc_hider in_stack_ffffffffffffe9a8;
  undefined8 in_stack_ffffffffffffe9b0;
  undefined8 in_stack_ffffffffffffe9b8;
  undefined8 in_stack_ffffffffffffe9c0;
  undefined1 in_stack_ffffffffffffe9c8 [12];
  uint in_stack_ffffffffffffe9d4;
  undefined **ppuVar47;
  CMutableTransaction tx;
  _Head_base<0UL,_ECC_Context_*,_false> local_15c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pkData;
  CCoinsView viewDummy;
  CMutableTransaction txv;
  CMutableTransaction mergedTx;
  string value;
  string key;
  string arg;
  string strPrint;
  char buf [4096];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
  types;
  string local_458;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  size_t i;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  size_t i_1;
  undefined8 local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  COutPoint out;
  undefined1 local_388 [32];
  uint32_t numkeys;
  char cStack_364;
  char cStack_363;
  char cStack_362;
  char cStack_361;
  char acStack_360 [8];
  uchar local_358 [8];
  uchar auStack_350 [8];
  UniValue prevtxsObj;
  string valStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  vector<UniValue,_std::allocator<UniValue>_> local_2b0;
  string strHexTx;
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  local_260;
  __native_type _Stack_230;
  string filename;
  undefined1 uStack_1e4;
  undefined2 local_1e3;
  undefined1 local_1e1;
  undefined1 local_1e0 [24];
  vector<UniValue,_std::allocator<UniValue>_> avStack_1c8 [9];
  CoinsCachePair *local_e0;
  CoinsCachePair *local_d8;
  uint8_t local_d0;
  direct_or_indirect local_c0;
  uint local_a4;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_98;
  long local_38;
  
  buf[0x478] = '\0';
  buf[0x479] = '\0';
  buf[0x47a] = '\0';
  buf[0x47b] = '\0';
  buf[0x47c] = '\0';
  buf[0x47d] = '\0';
  buf[0x47e] = '\0';
  buf[0x47f] = '\0';
  uVar34 = (ulong)(uint)argc;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  strPrint._M_dataplus._M_p = (pointer)&strPrint.field_2;
  strPrint._M_string_length = 0;
  strPrint.field_2._M_local_buf[0] = '\0';
  if (1 < argc) {
    do {
      if ((*argv[1] != '-') || (argv[1][1] == '\0')) goto LAB_0011771a;
      argv = argv + 1;
      iVar12 = (int)uVar34;
      uVar34 = (ulong)(iVar12 - 1);
    } while (2 < iVar12);
    uVar34 = 1;
  }
LAB_0011771a:
  CMutableTransaction::CMutableTransaction(&tx);
  uVar35 = 1;
  if (fCreateBlank == false) {
    if ((int)uVar34 < 2) {
      prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar28,"too few parameters");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0011db6a;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&strHexTx,argv[1],(allocator<char> *)buf);
    iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare(&strHexTx,"-");
    if (iVar12 == 0) {
      filename._M_dataplus._M_p = (pointer)&filename.field_2;
      filename._M_string_length._0_4_ = 0;
      filename._M_string_length._4_4_ = 0;
      filename.field_2._M_allocated_capacity._0_4_ =
           filename.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      do {
        iVar12 = feof(_stdin);
        if (iVar12 != 0) break;
        sVar17 = fread(buf,1,0x1000,_stdin);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&filename,buf,sVar17);
      } while (0xfff < sVar17);
      iVar12 = ferror(_stdin);
      _Var30 = filename._M_dataplus;
      if (iVar12 != 0) {
        prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar28,"error reading stdin");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0011db6a;
      }
      uVar39 = CONCAT44(filename._M_string_length._4_4_,(undefined4)filename._M_string_length);
      pcVar38 = (pointer)0x0;
      uVar29 = 0;
      if (uVar39 != 0) {
        uVar24 = 0;
        do {
          pvVar14 = memchr(" \f\n\r\t\v",(int)_Var30._M_p[uVar24],6);
          if (pvVar14 == (void *)0x0) {
            pcVar38 = (pointer)0x0;
            uVar29 = 0;
            if (uVar24 == 0xffffffffffffffff) goto LAB_0011aafe;
            pcVar38 = _Var30._M_p + uVar24;
            uVar29 = uVar39;
            goto LAB_0011aab3;
          }
          uVar24 = uVar24 + 1;
        } while (uVar39 != uVar24);
        pcVar38 = (pointer)0x0;
        uVar29 = 0;
      }
      goto LAB_0011aafe;
    }
    goto LAB_0011777a;
  }
  goto LAB_001177c4;
  while (uVar29 != 0) {
LAB_0011aab3:
    uVar29 = uVar29 - 1;
    pvVar14 = memchr(" \f\n\r\t\v",(int)_Var30._M_p[uVar29],6);
    if (pvVar14 == (void *)0x0) goto LAB_0011aad8;
  }
  uVar29 = 0xffffffffffffffff;
LAB_0011aad8:
  if (uVar39 < uVar24) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar24,uVar39);
LAB_0011bcef:
      prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar28,"Uncompressed pubkeys are not useable for SegWit outputs");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    goto LAB_0011db6a;
  }
  uVar29 = (uVar29 - uVar24) + 1;
  if (uVar39 - uVar24 < uVar29) {
    uVar29 = uVar39 - uVar24;
  }
LAB_0011aafe:
  valStr._M_dataplus._M_p = (pointer)&valStr.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&valStr,pcVar38,pcVar38 + uVar29);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,
                    CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(filename.field_2._M_allocated_capacity._4_2_,
                                      filename.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&strHexTx,&valStr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)valStr._M_dataplus._M_p != &valStr.field_2) {
    operator_delete(valStr._M_dataplus._M_p,
                    CONCAT44(valStr.field_2._M_allocated_capacity._4_4_,
                             valStr.field_2._M_allocated_capacity._0_4_) + 1);
  }
LAB_0011777a:
  bVar11 = DecodeHexTx(&tx,&strHexTx,true,true);
  if (!bVar11) {
    prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar28,"invalid transaction encoding");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_0011db6a;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strHexTx._M_dataplus._M_p != &strHexTx.field_2) {
    operator_delete(strHexTx._M_dataplus._M_p,
                    CONCAT44(strHexTx.field_2._M_allocated_capacity._4_4_,
                             strHexTx.field_2._M_allocated_capacity._0_4_) + 1);
  }
  uVar35 = 2;
LAB_001177c4:
  if ((int)uVar35 < (int)uVar34) {
    uVar39 = (ulong)uVar35;
    ppuVar47 = &PTR__FillableSigningProvider_003d9818;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&arg,argv[uVar39],(allocator<char> *)buf);
      _Var30 = arg._M_dataplus;
      key._M_dataplus._M_p = (pointer)&key.field_2;
      key._M_string_length = 0;
      key.field_2._M_local_buf[0] = '\0';
      value._M_dataplus._M_p = (pointer)&value.field_2;
      value._M_string_length = 0;
      value.field_2._M_local_buf[0] = '\0';
      if (arg._M_string_length == 0) {
LAB_001178a9:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&key,&arg);
      }
      else {
        pvVar14 = memchr(arg._M_dataplus._M_p,0x3d,arg._M_string_length);
        sVar40 = (long)pvVar14 - (long)_Var30._M_p;
        if (pvVar14 == (void *)0x0 || sVar40 == 0xffffffffffffffff) goto LAB_001178a9;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,&arg,0,
                   sVar40);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf);
        if ((char *)buf._0_8_ != buf + 0x10) {
          operator_delete((void *)buf._0_8_,
                          CONCAT17(buf[0x17],CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_))) +
                          1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,&arg,
                   sVar40 + 1,0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf);
        if ((char *)buf._0_8_ != buf + 0x10) {
          operator_delete((void *)buf._0_8_,
                          CONCAT17(buf[0x17],CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_))) +
                          1);
        }
      }
      local_15c0._M_head_impl = (ECC_Context *)0x0;
      iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(&key,"nversion");
      if (iVar12 == 0) {
        str_01._M_str = value._M_dataplus._M_p;
        str_01._M_len = value._M_string_length;
        bVar11 = ParseUInt32(str_01,(uint32_t *)&strHexTx);
        if (!bVar11 || 2 < (uint32_t)strHexTx._M_dataplus._M_p - 1) {
          prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&filename,"Invalid TX version requested: \'",&value);
          pbVar25 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&filename,"\'");
          buf._0_8_ = (pbVar25->_M_dataplus)._M_p;
          paVar32 = &pbVar25->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)buf._0_8_ == paVar32) {
            uVar2 = *(undefined8 *)paVar32;
            uVar4 = *(undefined8 *)((long)&pbVar25->field_2 + 8);
            buf._16_4_ = (undefined4)uVar2;
            buf[0x14] = (char)((ulong)uVar2 >> 0x20);
            buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
            buf[0x17] = (char)((ulong)uVar2 >> 0x38);
            buf._24_3_ = (undefined3)uVar4;
            buf[0x1b] = (char)((ulong)uVar4 >> 0x18);
            buf._28_4_ = (undefined4)((ulong)uVar4 >> 0x20);
            buf._0_8_ = buf + 0x10;
          }
          else {
            uVar2 = *(undefined8 *)paVar32;
            buf._16_4_ = (undefined4)uVar2;
            buf[0x14] = (char)((ulong)uVar2 >> 0x20);
            buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
            buf[0x17] = (char)((ulong)uVar2 >> 0x38);
          }
          buf._8_8_ = pbVar25->_M_string_length;
          (pbVar25->_M_dataplus)._M_p = (pointer)paVar32;
          pbVar25->_M_string_length = 0;
          (pbVar25->field_2)._M_local_buf[0] = '\0';
          std::runtime_error::runtime_error(prVar28,(string *)buf);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0011db6a;
        }
        tx.version = (uint32_t)strHexTx._M_dataplus._M_p;
      }
      else {
        iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(&key,"locktime");
        if (iVar12 == 0) {
          str_02._M_str = value._M_dataplus._M_p;
          str_02._M_len = value._M_string_length;
          bVar11 = ParseInt64(str_02,(int64_t *)&strHexTx);
          if ((ulong)strHexTx._M_dataplus._M_p >> 0x20 != 0 || !bVar11) {
            prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&filename,"Invalid TX locktime requested: \'",&value);
            pbVar25 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&filename,"\'");
            buf._0_8_ = (pbVar25->_M_dataplus)._M_p;
            paVar32 = &pbVar25->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)buf._0_8_ == paVar32) {
              uVar2 = *(undefined8 *)paVar32;
              uVar4 = *(undefined8 *)((long)&pbVar25->field_2 + 8);
              buf._16_4_ = (undefined4)uVar2;
              buf[0x14] = (char)((ulong)uVar2 >> 0x20);
              buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
              buf[0x17] = (char)((ulong)uVar2 >> 0x38);
              buf._24_3_ = (undefined3)uVar4;
              buf[0x1b] = (char)((ulong)uVar4 >> 0x18);
              buf._28_4_ = (undefined4)((ulong)uVar4 >> 0x20);
              buf._0_8_ = buf + 0x10;
            }
            else {
              uVar2 = *(undefined8 *)paVar32;
              buf._16_4_ = (undefined4)uVar2;
              buf[0x14] = (char)((ulong)uVar2 >> 0x20);
              buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
              buf[0x17] = (char)((ulong)uVar2 >> 0x38);
            }
            buf._8_8_ = pbVar25->_M_string_length;
            (pbVar25->_M_dataplus)._M_p = (pointer)paVar32;
            pbVar25->_M_string_length = 0;
            (pbVar25->field_2)._M_local_buf[0] = '\0';
            std::runtime_error::runtime_error(prVar28,(string *)buf);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_0011db6a;
          }
          tx.nLockTime = (uint32_t)strHexTx._M_dataplus._M_p;
        }
        else {
          iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare(&key,"replaceable");
          if (iVar12 == 0) {
            strHexTx._M_dataplus._M_p = (pointer)0xffffffffffffffff;
            iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::compare(&value,"");
            if (iVar12 != 0) {
              str_03._M_str = value._M_dataplus._M_p;
              str_03._M_len = value._M_string_length;
              bVar11 = ParseInt64(str_03,(int64_t *)&strHexTx);
              if ((!bVar11 || (long)strHexTx._M_dataplus._M_p < 0) ||
                 (lVar44 = (long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 3,
                 SBORROW8((long)strHexTx._M_dataplus._M_p,lVar44 * 0x4ec4ec4ec4ec4ec5) ==
                 (long)(strHexTx._M_dataplus._M_p + lVar44 * -0x4ec4ec4ec4ec4ec5) < 0)) {
                prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&filename,"Invalid TX input index \'",&value);
                pbVar25 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&filename,"\'");
                buf._0_8_ = (pbVar25->_M_dataplus)._M_p;
                paVar32 = &pbVar25->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)buf._0_8_ == paVar32) {
                  uVar2 = *(undefined8 *)paVar32;
                  uVar4 = *(undefined8 *)((long)&pbVar25->field_2 + 8);
                  buf._16_4_ = (undefined4)uVar2;
                  buf[0x14] = (char)((ulong)uVar2 >> 0x20);
                  buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
                  buf[0x17] = (char)((ulong)uVar2 >> 0x38);
                  buf._24_3_ = (undefined3)uVar4;
                  buf[0x1b] = (char)((ulong)uVar4 >> 0x18);
                  buf._28_4_ = (undefined4)((ulong)uVar4 >> 0x20);
                  buf._0_8_ = buf + 0x10;
                }
                else {
                  uVar2 = *(undefined8 *)paVar32;
                  buf._16_4_ = (undefined4)uVar2;
                  buf[0x14] = (char)((ulong)uVar2 >> 0x20);
                  buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
                  buf[0x17] = (char)((ulong)uVar2 >> 0x38);
                }
                buf._8_8_ = pbVar25->_M_string_length;
                (pbVar25->_M_dataplus)._M_p = (pointer)paVar32;
                pbVar25->_M_string_length = 0;
                (pbVar25->field_2)._M_local_buf[0] = '\0';
                std::runtime_error::runtime_error(prVar28,(string *)buf);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_0011db6a;
              }
            }
            pCVar7 = tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start !=
                tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pcVar38 = (pointer)0x0;
              pCVar41 = tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                iVar12 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   (&value,"");
                if (((iVar12 == 0) || (pcVar38 == strHexTx._M_dataplus._M_p)) &&
                   (0xfffffffd < pCVar41->nSequence)) {
                  pCVar41->nSequence = 0xfffffffd;
                }
                pcVar38 = pcVar38 + 1;
                pCVar41 = pCVar41 + 1;
              } while (pCVar41 != pCVar7);
            }
          }
          else {
            iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::compare(&key,"delin");
            if (iVar12 == 0) {
              str_04._M_str = value._M_dataplus._M_p;
              str_04._M_len = value._M_string_length;
              bVar11 = ParseInt64(str_04,(int64_t *)&strHexTx);
              if ((!bVar11 || (long)strHexTx._M_dataplus._M_p < 0) ||
                 (lVar44 = (long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 3,
                 SBORROW8((long)strHexTx._M_dataplus._M_p,lVar44 * 0x4ec4ec4ec4ec4ec5) ==
                 (long)(strHexTx._M_dataplus._M_p + lVar44 * -0x4ec4ec4ec4ec4ec5) < 0)) {
                prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&filename,"Invalid TX input index \'",&value);
                pbVar25 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&filename,"\'");
                buf._0_8_ = (pbVar25->_M_dataplus)._M_p;
                paVar32 = &pbVar25->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)buf._0_8_ == paVar32) {
                  uVar2 = *(undefined8 *)paVar32;
                  uVar4 = *(undefined8 *)((long)&pbVar25->field_2 + 8);
                  buf._16_4_ = (undefined4)uVar2;
                  buf[0x14] = (char)((ulong)uVar2 >> 0x20);
                  buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
                  buf[0x17] = (char)((ulong)uVar2 >> 0x38);
                  buf._24_3_ = (undefined3)uVar4;
                  buf[0x1b] = (char)((ulong)uVar4 >> 0x18);
                  buf._28_4_ = (undefined4)((ulong)uVar4 >> 0x20);
                  buf._0_8_ = buf + 0x10;
                }
                else {
                  uVar2 = *(undefined8 *)paVar32;
                  buf._16_4_ = (undefined4)uVar2;
                  buf[0x14] = (char)((ulong)uVar2 >> 0x20);
                  buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
                  buf[0x17] = (char)((ulong)uVar2 >> 0x38);
                }
                buf._8_8_ = pbVar25->_M_string_length;
                (pbVar25->_M_dataplus)._M_p = (pointer)paVar32;
                pbVar25->_M_string_length = 0;
                (pbVar25->field_2)._M_local_buf[0] = '\0';
                std::runtime_error::runtime_error(prVar28,(string *)buf);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_0011db6a;
              }
              std::vector<CTxIn,_std::allocator<CTxIn>_>::_M_erase
                        (&tx.vin,tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_start + (long)strHexTx._M_dataplus._M_p)
              ;
            }
            else {
              iVar12 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 (&key,"in");
              if (iVar12 == 0) {
                buf._0_8_ = value._M_dataplus._M_p;
                buf[8] = (undefined1)value._M_string_length;
                buf[9] = value._M_string_length._1_1_;
                buf[10] = value._M_string_length._2_1_;
                buf[0xb] = value._M_string_length._3_1_;
                buf[0xc] = value._M_string_length._4_1_;
                buf[0xd] = value._M_string_length._5_1_;
                buf[0xe] = value._M_string_length._6_1_;
                buf[0xf] = value._M_string_length._7_1_;
                strHexTx._M_dataplus._M_p._0_1_ = 0x3a;
                separators._M_str = (char *)in_R8;
                separators._M_len = (size_t)&strHexTx;
                util::Split<std::__cxx11::string>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&valStr,(util *)buf,(Span<const_char> *)0x1,separators);
                str._M_str = (char *)(valStr._M_string_length - (long)valStr._M_dataplus._M_p);
                if (str._M_str < (char *)0x21) {
                  prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar28,"TX input missing separator");
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_0011db6a;
                }
                str._M_len = *(size_t *)valStr._M_dataplus._M_p;
                detail::FromHex<uint256>
                          ((optional<uint256> *)buf,*(detail **)(valStr._M_dataplus._M_p + 8),str);
                _Var30 = valStr._M_dataplus;
                if (buf[0x20] == '\0') {
                  prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar28,"invalid TX input txid");
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_0011db6a;
                }
                uVar5 = CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_));
                filename.field_2._8_4_ = CONCAT13(buf[0x1b],buf._24_3_);
                filename.field_2._0_1_ = buf[0x10];
                filename.field_2._1_1_ = buf[0x11];
                filename.field_2._2_1_ = buf[0x12];
                filename.field_2._3_1_ = buf[0x13];
                filename.field_2._M_allocated_capacity._4_2_ = (undefined2)((uint7)uVar5 >> 0x20);
                filename.field_2._M_allocated_capacity._6_2_ =
                     (undefined2)(CONCAT17(buf[0x17],uVar5) >> 0x30);
                filename.field_2._12_1_ = buf[0x1c];
                filename.field_2._13_1_ = buf[0x1d];
                filename.field_2._14_1_ = buf[0x1e];
                filename.field_2._15_1_ = buf[0x1f];
                filename._M_dataplus._M_p = (pointer)buf._0_8_;
                filename._M_string_length._0_4_ = (undefined4)buf._8_8_;
                filename._M_string_length._4_4_ = SUB84(buf._8_8_,4);
                str_05._M_str = *(char **)(valStr._M_dataplus._M_p + 0x20);
                str_05._M_len = *(size_t *)(valStr._M_dataplus._M_p + 0x28);
                bVar11 = ParseInt64(str_05,(int64_t *)&prevtxsObj);
                _Var10 = valStr._M_dataplus;
                if (!bVar11 || 0x1b207 < (ulong)prevtxsObj._0_8_) {
                  pbVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __cxa_allocate_exception(0x10);
                  std::operator+(&strHexTx,"invalid TX input vout \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(_Var30._M_p + 0x20));
                  pbVar26 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            append(&strHexTx,"\'");
                  auVar6._8_8_ = buf + 0x10;
                  auVar6._0_8_ = pbVar26;
                  pcVar38 = (pbVar26->_M_dataplus)._M_p;
                  auVar46._8_8_ = pcVar38;
                  auVar46._0_8_ = pbVar26;
                  _Var30._M_p = (pointer)&pbVar26->field_2;
                  if (pcVar38 == _Var30._M_p) {
                    uVar2 = *(undefined8 *)_Var30._M_p;
                    uVar4 = *(undefined8 *)((long)&pbVar26->field_2 + 8);
                    buf._16_4_ = (undefined4)uVar2;
                    buf[0x14] = (char)((ulong)uVar2 >> 0x20);
                    buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
                    buf[0x17] = (char)((ulong)uVar2 >> 0x38);
                    buf._24_3_ = (undefined3)uVar4;
                    buf[0x1b] = (char)((ulong)uVar4 >> 0x18);
                    buf._28_4_ = (undefined4)((ulong)uVar4 >> 0x20);
                  }
                  else {
LAB_0011ba84:
                    uVar2 = *(undefined8 *)_Var30._M_p;
                    buf._16_4_ = (undefined4)uVar2;
                    buf[0x14] = (char)((ulong)uVar2 >> 0x20);
                    buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
                    buf[0x17] = (char)((ulong)uVar2 >> 0x38);
                    auVar6 = auVar46;
                  }
                  buf._0_8_ = auVar6._8_8_;
                  puVar27 = auVar6._0_8_;
                  buf._8_8_ = puVar27[1];
                  *puVar27 = _Var30._M_p;
                  puVar27[1] = 0;
                  *(undefined1 *)(puVar27 + 2) = 0;
                  std::runtime_error::runtime_error((runtime_error *)pbVar25,(string *)buf);
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    __cxa_throw(pbVar25,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_0011db6a;
                }
                if (0x40 < valStr._M_string_length - (long)valStr._M_dataplus._M_p) {
                  buf._0_8_ = buf + 0x10;
                  strHexTx._M_dataplus._M_p = (pointer)0x16;
                  buf._0_8_ = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)buf,(size_type *)&strHexTx,0);
                  buf._16_4_ = SUB84(strHexTx._M_dataplus._M_p,0);
                  buf[0x14] = (char)((ulong)strHexTx._M_dataplus._M_p >> 0x20);
                  buf._21_2_ = (undefined2)((ulong)strHexTx._M_dataplus._M_p >> 0x28);
                  buf[0x17] = (char)((ulong)strHexTx._M_dataplus._M_p >> 0x38);
                  builtin_strncpy((char *)buf._0_8_,"invalid TX sequence id",0x16);
                  buf._8_8_ = strHexTx._M_dataplus._M_p;
                  *(buf._0_8_ + strHexTx._M_dataplus._M_p) = '\0';
                  TrimAndParse<unsigned_int>
                            ((string *)(_Var10._M_p + 0x40),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             buf);
                  if ((char *)buf._0_8_ != buf + 0x10) {
                    operator_delete((void *)buf._0_8_,
                                    CONCAT17(buf[0x17],
                                             CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_))) +
                                    1);
                  }
                }
                strHexTx._M_dataplus._M_p = (pointer)0x0;
                strHexTx._M_string_length._0_4_ = 0;
                strHexTx._M_string_length._4_4_ = 0;
                strHexTx.field_2._M_allocated_capacity._0_4_ = 0;
                strHexTx.field_2._M_allocated_capacity._4_4_ = 0;
                strHexTx.field_2._8_4_ = 0;
                strHexTx.field_2._12_4_ = 0;
                in_stack_ffffffffffffe9b0 =
                     CONCAT44(filename._M_string_length._4_4_,(undefined4)filename._M_string_length)
                ;
                in_stack_ffffffffffffe9b8 =
                     CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                              CONCAT24(filename.field_2._M_allocated_capacity._4_2_,
                                       filename.field_2._M_allocated_capacity._0_4_));
                in_stack_ffffffffffffe9c0 = CONCAT44(filename.field_2._12_4_,filename.field_2._8_4_)
                ;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
                     (char)(undefined4)filename._M_string_length;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
                     (char)((uint)(undefined4)filename._M_string_length >> 8);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
                     (char)((uint)(undefined4)filename._M_string_length >> 0x10);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
                     (char)((uint)(undefined4)filename._M_string_length >> 0x18);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
                     (char)filename._M_string_length._4_4_;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
                     (char)((uint)filename._M_string_length._4_4_ >> 8);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
                     (char)((uint)filename._M_string_length._4_4_ >> 0x10);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
                     (char)((uint)filename._M_string_length._4_4_ >> 0x18);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
                     filename._M_dataplus._M_p;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
                     (char)filename.field_2._0_4_;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
                     (char)((uint)filename.field_2._0_4_ >> 8);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
                     (char)((uint)filename.field_2._0_4_ >> 0x10);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
                     (char)((uint)filename.field_2._0_4_ >> 0x18);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
                     (char)filename.field_2._4_2_;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
                     (char)((ushort)filename.field_2._4_2_ >> 8);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
                     (char)filename.field_2._6_2_;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
                     (char)((ushort)filename.field_2._6_2_ >> 8);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
                     (char)filename.field_2._8_4_;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
                     (char)((uint)filename.field_2._8_4_ >> 8);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
                     (char)((uint)filename.field_2._8_4_ >> 0x10);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
                     (char)((uint)filename.field_2._8_4_ >> 0x18);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
                     (char)filename.field_2._12_4_;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
                     (char)((uint)filename.field_2._12_4_ >> 8);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
                     (char)((uint)filename.field_2._12_4_ >> 0x10);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
                     (char)((uint)filename.field_2._12_4_ >> 0x18);
                scriptSigIn.super_CScriptBase._union._12_4_ = in_stack_ffffffffffffe9d4;
                scriptSigIn.super_CScriptBase._union._0_8_ = (char *)in_stack_ffffffffffffe9c8._0_8_
                ;
                scriptSigIn.super_CScriptBase._union._8_4_ = in_stack_ffffffffffffe9c8._8_4_;
                scriptSigIn.super_CScriptBase._union._16_8_ = ppuVar47;
                scriptSigIn.super_CScriptBase._24_8_ = uVar34;
                in_stack_ffffffffffffe9a8._M_p = filename._M_dataplus._M_p;
                CTxIn::CTxIn((CTxIn *)buf,hashPrevTx,prevtxsObj.typ,scriptSigIn,(uint32_t)&strHexTx)
                ;
                pUVar20 = (UniValue *)&valStr;
                if (0x1c < (uint)strHexTx.field_2._12_4_) {
                  free(strHexTx._M_dataplus._M_p);
                  strHexTx._M_dataplus._M_p = (pointer)0x0;
                }
                std::vector<CTxIn,_std::allocator<CTxIn>_>::push_back(&tx.vin,(value_type *)buf);
                std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)(buf + 0x50));
                if (0x1c < (uint)buf._68_4_) {
                  free((void *)buf._40_8_);
                }
LAB_001190f4:
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)pUVar20);
              }
              else {
                iVar12 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   (&key,"delout");
                if (iVar12 == 0) {
                  str_06._M_str = value._M_dataplus._M_p;
                  str_06._M_len = value._M_string_length;
                  bVar11 = ParseInt64(str_06,(int64_t *)&strHexTx);
                  if ((!bVar11 || (long)strHexTx._M_dataplus._M_p < 0) ||
                     (lVar44 = (long)tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3,
                     SBORROW8((long)strHexTx._M_dataplus._M_p,lVar44 * -0x3333333333333333) ==
                     (long)(strHexTx._M_dataplus._M_p + lVar44 * 0x3333333333333333) < 0)) {
                    prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::operator+(&filename,"Invalid TX output index \'",&value);
                    pbVar25 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              append(&filename,"\'");
                    buf._0_8_ = (pbVar25->_M_dataplus)._M_p;
                    paVar32 = &pbVar25->field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)buf._0_8_ == paVar32) {
                      uVar2 = *(undefined8 *)paVar32;
                      uVar4 = *(undefined8 *)((long)&pbVar25->field_2 + 8);
                      buf._16_4_ = (undefined4)uVar2;
                      buf[0x14] = (char)((ulong)uVar2 >> 0x20);
                      buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
                      buf[0x17] = (char)((ulong)uVar2 >> 0x38);
                      buf._24_3_ = (undefined3)uVar4;
                      buf[0x1b] = (char)((ulong)uVar4 >> 0x18);
                      buf._28_4_ = (undefined4)((ulong)uVar4 >> 0x20);
                      buf._0_8_ = buf + 0x10;
                    }
                    else {
                      uVar2 = *(undefined8 *)paVar32;
                      buf._16_4_ = (undefined4)uVar2;
                      buf[0x14] = (char)((ulong)uVar2 >> 0x20);
                      buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
                      buf[0x17] = (char)((ulong)uVar2 >> 0x38);
                    }
                    buf._8_8_ = pbVar25->_M_string_length;
                    (pbVar25->_M_dataplus)._M_p = (pointer)paVar32;
                    pbVar25->_M_string_length = 0;
                    (pbVar25->field_2)._M_local_buf[0] = '\0';
                    std::runtime_error::runtime_error(prVar28,(string *)buf);
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    goto LAB_0011db6a;
                  }
                  std::vector<CTxOut,_std::allocator<CTxOut>_>::_M_erase
                            (&tx.vout,tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                      _M_impl.super__Vector_impl_data._M_start +
                                      (long)strHexTx._M_dataplus._M_p);
                }
                else {
                  iVar12 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           compare(&key,"outaddr");
                  if (iVar12 == 0) {
                    buf._0_8_ = value._M_dataplus._M_p;
                    buf[8] = (undefined1)value._M_string_length;
                    buf[9] = value._M_string_length._1_1_;
                    buf[10] = value._M_string_length._2_1_;
                    buf[0xb] = value._M_string_length._3_1_;
                    buf[0xc] = value._M_string_length._4_1_;
                    buf[0xd] = value._M_string_length._5_1_;
                    buf[0xe] = value._M_string_length._6_1_;
                    buf[0xf] = value._M_string_length._7_1_;
                    strHexTx._M_dataplus._M_p._0_1_ = 0x3a;
                    separators_00._M_str = (char *)in_R8;
                    separators_00._M_len = (size_t)&strHexTx;
                    util::Split<std::__cxx11::string>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&mergedTx,(util *)buf,(Span<const_char> *)0x1,separators_00);
                    if ((long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                        (long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                              .super__Vector_impl_data._M_start == 0x40) {
                      types._M_t._M_impl._0_8_ =
                           ExtractAndValidateValue
                                     ((string *)
                                      mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                      strHexTx._M_dataplus._M_p = (pointer)&strHexTx.field_2;
                      lVar44 = *(long *)&((mergedTx.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start)->prevout).n;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&strHexTx,lVar44,
                                 ((mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->scriptSig).
                                 super_CScriptBase._union.indirect_contents.indirect + lVar44);
                      DecodeDestination((CTxDestination *)buf,&strHexTx);
                      bVar11 = IsValidDestination((CTxDestination *)buf);
                      if (bVar11) {
                        GetScriptForDestination((CScript *)&valStr,(CTxDestination *)buf);
                        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&prevtxsObj,
                                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&valStr);
                        scriptPubKeyIn.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffe9b0;
                        scriptPubKeyIn.super_CScriptBase._union.indirect_contents.indirect =
                             in_stack_ffffffffffffe9a8._M_p;
                        scriptPubKeyIn.super_CScriptBase._union._16_8_ = in_stack_ffffffffffffe9b8;
                        scriptPubKeyIn.super_CScriptBase._24_8_ = in_stack_ffffffffffffe9c0;
                        CTxOut::CTxOut((CTxOut *)&filename,(CAmount *)&types,scriptPubKeyIn);
                        if (0x1c < (uint)prevtxsObj.val.field_2._M_allocated_capacity._4_4_) {
                          free((void *)prevtxsObj._0_8_);
                          prevtxsObj.typ = VNULL;
                          prevtxsObj._4_4_ = 0;
                        }
                        std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                                  (&tx.vout,(value_type *)&filename);
                        if (0x1c < CONCAT13(local_1e1,CONCAT21(local_1e3,uStack_1e4))) {
                          free((void *)filename._M_string_length);
                        }
                        if (0x1c < CONCAT13(valStr.field_2._M_local_buf[0xf],
                                            CONCAT21(valStr.field_2._13_2_,
                                                     valStr.field_2._M_local_buf[0xc]))) {
                          free(valStr._M_dataplus._M_p);
                        }
                        std::__detail::__variant::
                        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                             *)buf);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)strHexTx._M_dataplus._M_p != &strHexTx.field_2) {
                          lVar44 = CONCAT44(strHexTx.field_2._M_allocated_capacity._4_4_,
                                            strHexTx.field_2._M_allocated_capacity._0_4_);
                          _Var30 = strHexTx._M_dataplus;
LAB_001181ed:
                          uVar29 = lVar44 + 1;
                          goto LAB_001190e7;
                        }
LAB_001190ec:
                        pUVar20 = (UniValue *)&mergedTx;
                        goto LAB_001190f4;
                      }
                      prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar28,"invalid TX output address");
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                    }
                    else {
                      prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                (prVar28,"TX output missing or too many separators");
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                    }
                    goto LAB_0011db6a;
                  }
                  iVar12 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           compare(&key,"outpubkey");
                  if (iVar12 == 0) {
                    pEVar15 = (ECC_Context *)operator_new(1);
                    ECC_Context::ECC_Context(pEVar15);
                    _Var8._M_head_impl = local_15c0._M_head_impl;
                    bVar11 = local_15c0._M_head_impl != (ECC_Context *)0x0;
                    local_15c0._M_head_impl = pEVar15;
                    if (bVar11) {
                      ECC_Context::~ECC_Context(_Var8._M_head_impl);
                      operator_delete(_Var8._M_head_impl,1);
                    }
                    buf._0_8_ = value._M_dataplus._M_p;
                    buf[8] = (undefined1)value._M_string_length;
                    buf[9] = value._M_string_length._1_1_;
                    buf[10] = value._M_string_length._2_1_;
                    buf[0xb] = value._M_string_length._3_1_;
                    buf[0xc] = value._M_string_length._4_1_;
                    buf[0xd] = value._M_string_length._5_1_;
                    buf[0xe] = value._M_string_length._6_1_;
                    buf[0xf] = value._M_string_length._7_1_;
                    strHexTx._M_dataplus._M_p._0_1_ = 0x3a;
                    separators_01._M_str = (char *)in_R8;
                    separators_01._M_len = (size_t)&strHexTx;
                    util::Split<std::__cxx11::string>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&prevtxsObj,(util *)buf,(Span<const_char> *)0x1,separators_01);
                    if (((long)prevtxsObj.val._M_dataplus._M_p - prevtxsObj._0_8_ &
                        0xffffffffffffffc0U) == 0x40) {
                      mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           (pointer)ExtractAndValidateValue((string *)prevtxsObj._0_8_);
                      hex_str._M_str = *(char **)(prevtxsObj._0_8_ + 0x20);
                      hex_str._M_len = *(size_t *)(prevtxsObj._0_8_ + 0x28);
                      ParseHex<unsigned_char>
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buf,
                                 hex_str);
                      CPubKey::Set<unsigned_char_const*>
                                ((CPubKey *)&filename,(uchar *)buf._0_8_,(uchar *)buf._8_8_);
                      if (buf._0_8_ != 0) {
                        operator_delete((void *)buf._0_8_,
                                        CONCAT17(buf[0x17],
                                                 CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_))
                                                ) - buf._0_8_);
                      }
                      bVar11 = CPubKey::IsFullyValid((CPubKey *)&filename);
                      if (bVar11) {
                        GetScriptForRawPubKey((CScript *)&strHexTx,(CPubKey *)&filename);
                        if ((long)prevtxsObj.val._M_dataplus._M_p - prevtxsObj._0_8_ == 0x60) {
                          buf._0_8_ = buf + 0x10;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)buf,*(long *)(prevtxsObj._0_8_ + 0x40),
                                     *(long *)(prevtxsObj._0_8_ + 0x48) +
                                     *(long *)(prevtxsObj._0_8_ + 0x40));
                          uVar4 = buf._8_8_;
                          uVar2 = buf._0_8_;
                          if (buf._8_8_ == 0) {
                            bVar37 = false;
                            bVar11 = true;
                          }
                          else {
                            pvVar14 = memchr((void *)buf._0_8_,0x57,buf._8_8_);
                            bVar37 = (long)pvVar14 - uVar2 != -1 && pvVar14 != (void *)0x0;
                            pvVar14 = memchr((void *)uVar2,0x53,uVar4);
                            bVar11 = (long)pvVar14 - uVar2 == -1 || pvVar14 == (void *)0x0;
                          }
                          if ((char *)uVar2 != buf + 0x10) {
                            operator_delete((void *)uVar2,
                                            CONCAT17(buf[0x17],
                                                     CONCAT25(buf._21_2_,
                                                              CONCAT14(buf[0x14],buf._16_4_))) + 1);
                          }
                          if (bVar37) {
                            if (((byte)filename._M_dataplus._M_p & 0xfe) != 2) goto LAB_0011bcef;
                            WitnessV0KeyHash::WitnessV0KeyHash
                                      ((WitnessV0KeyHash *)&types,(CPubKey *)&filename);
                            buf[0x10] = (char)types._M_t._M_impl.super__Rb_tree_header._M_header.
                                              _M_parent;
                            buf[0x11] = types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                        ._1_1_;
                            buf[0x12] = types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                        ._2_1_;
                            buf[0x13] = types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                        ._3_1_;
                            buf[0] = types._M_t._M_impl._0_1_;
                            buf[1] = types._M_t._M_impl._1_1_;
                            buf[2] = types._M_t._M_impl._2_1_;
                            buf[3] = types._M_t._M_impl._3_1_;
                            buf[4] = types._M_t._M_impl._4_1_;
                            buf[5] = types._M_t._M_impl._5_1_;
                            buf[6] = types._M_t._M_impl._6_1_;
                            buf[7] = types._M_t._M_impl._7_1_;
                            buf._8_8_ = types._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                            buf[0x48] = '\x05';
                            GetScriptForDestination((CScript *)&valStr,(CTxDestination *)buf);
                            if (0x1c < (uint)strHexTx.field_2._12_4_) {
                              free(strHexTx._M_dataplus._M_p);
                            }
                            strHexTx.field_2._M_allocated_capacity._0_4_ =
                                 valStr.field_2._M_allocated_capacity._0_4_;
                            strHexTx.field_2._M_allocated_capacity._4_4_ =
                                 valStr.field_2._M_allocated_capacity._4_4_;
                            strHexTx.field_2._8_4_ = valStr.field_2._8_4_;
                            strHexTx._M_dataplus = valStr._M_dataplus;
                            strHexTx.field_2._12_4_ =
                                 CONCAT13(valStr.field_2._M_local_buf[0xf],
                                          CONCAT21(valStr.field_2._13_2_,
                                                   valStr.field_2._M_local_buf[0xc]));
                            valStr.field_2._M_local_buf[0xc] = '\0';
                            valStr.field_2._13_2_ = 0;
                            valStr.field_2._M_local_buf[0xf] = '\0';
                            strHexTx._M_string_length = valStr._M_string_length;
                            std::__detail::__variant::
                            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                                 *)buf);
                          }
                          if (!bVar11) {
                            ScriptHash::ScriptHash((ScriptHash *)&types,(CScript *)&strHexTx);
                            buf[0x10] = (char)types._M_t._M_impl.super__Rb_tree_header._M_header.
                                              _M_parent;
                            buf[0x11] = types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                        ._1_1_;
                            buf[0x12] = types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                        ._2_1_;
                            buf[0x13] = types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                        ._3_1_;
                            buf[0] = types._M_t._M_impl._0_1_;
                            buf[1] = types._M_t._M_impl._1_1_;
                            buf[2] = types._M_t._M_impl._2_1_;
                            buf[3] = types._M_t._M_impl._3_1_;
                            buf[4] = types._M_t._M_impl._4_1_;
                            buf[5] = types._M_t._M_impl._5_1_;
                            buf[6] = types._M_t._M_impl._6_1_;
                            buf[7] = types._M_t._M_impl._7_1_;
                            buf._8_8_ = types._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                            buf[0x48] = '\x03';
                            GetScriptForDestination((CScript *)&valStr,(CTxDestination *)buf);
                            if (0x1c < (uint)strHexTx.field_2._12_4_) {
                              free(strHexTx._M_dataplus._M_p);
                            }
                            strHexTx.field_2._M_allocated_capacity._0_4_ =
                                 valStr.field_2._M_allocated_capacity._0_4_;
                            strHexTx.field_2._M_allocated_capacity._4_4_ =
                                 valStr.field_2._M_allocated_capacity._4_4_;
                            strHexTx.field_2._8_4_ = valStr.field_2._8_4_;
                            strHexTx._M_dataplus = valStr._M_dataplus;
                            strHexTx.field_2._12_4_ =
                                 CONCAT13(valStr.field_2._M_local_buf[0xf],
                                          CONCAT21(valStr.field_2._13_2_,
                                                   valStr.field_2._M_local_buf[0xc]));
                            valStr.field_2._M_local_buf[0xc] = '\0';
                            valStr.field_2._13_2_ = 0;
                            valStr.field_2._M_local_buf[0xf] = '\0';
                            strHexTx._M_string_length = valStr._M_string_length;
                            std::__detail::__variant::
                            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                                 *)buf);
                          }
                        }
                        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&valStr,
                                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&strHexTx);
                        scriptPubKeyIn_01.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffe9b0
                        ;
                        scriptPubKeyIn_01.super_CScriptBase._union.indirect_contents.indirect =
                             in_stack_ffffffffffffe9a8._M_p;
                        scriptPubKeyIn_01.super_CScriptBase._union._16_8_ =
                             in_stack_ffffffffffffe9b8;
                        scriptPubKeyIn_01.super_CScriptBase._24_8_ = in_stack_ffffffffffffe9c0;
                        CTxOut::CTxOut((CTxOut *)buf,(CAmount *)&mergedTx,scriptPubKeyIn_01);
                        if (0x1c < CONCAT13(valStr.field_2._M_local_buf[0xf],
                                            CONCAT21(valStr.field_2._13_2_,
                                                     valStr.field_2._M_local_buf[0xc]))) {
                          free(valStr._M_dataplus._M_p);
                          valStr._M_dataplus._M_p = (pointer)0x0;
                        }
                        std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                                  (&tx.vout,(value_type *)buf);
                        if (0x1c < (uint)buf._36_4_) {
                          free((void *)buf._8_8_);
                        }
                        if (0x1c < (uint)strHexTx.field_2._12_4_) {
                          free(strHexTx._M_dataplus._M_p);
                        }
                        pUVar20 = &prevtxsObj;
                        goto LAB_001190f4;
                      }
                      prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar28,"invalid TX output pubkey");
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                    }
                    else {
                      prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                (prVar28,"TX output missing or too many separators");
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                    }
                    goto LAB_0011db6a;
                  }
                  iVar12 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           compare(&key,"outmultisig");
                  if (iVar12 == 0) {
                    pEVar15 = (ECC_Context *)operator_new(1);
                    ECC_Context::ECC_Context(pEVar15);
                    _Var8._M_head_impl = local_15c0._M_head_impl;
                    bVar11 = local_15c0._M_head_impl != (ECC_Context *)0x0;
                    local_15c0._M_head_impl = pEVar15;
                    if (bVar11) {
                      ECC_Context::~ECC_Context(_Var8._M_head_impl);
                      operator_delete(_Var8._M_head_impl,1);
                    }
                    buf._0_8_ = value._M_dataplus._M_p;
                    buf[8] = (undefined1)value._M_string_length;
                    buf[9] = value._M_string_length._1_1_;
                    buf[10] = value._M_string_length._2_1_;
                    buf[0xb] = value._M_string_length._3_1_;
                    buf[0xc] = value._M_string_length._4_1_;
                    buf[0xd] = value._M_string_length._5_1_;
                    buf[0xe] = value._M_string_length._6_1_;
                    buf[0xf] = value._M_string_length._7_1_;
                    strHexTx._M_dataplus._M_p._0_1_ = 0x3a;
                    separators_02._M_str = (char *)in_R8;
                    separators_02._M_len = (size_t)&strHexTx;
                    util::Split<std::__cxx11::string>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&mergedTx,(util *)buf,(Span<const_char> *)0x1,separators_02);
                    if ((ulong)((long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start) < 0x41) {
                      prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar28,"Not enough multisig parameters");
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      goto LAB_0011db6a;
                    }
                    txv.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         (pointer)ExtractAndValidateValue
                                            ((string *)
                                             mergedTx.vin.
                                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                             _M_impl.super__Vector_impl_data._M_start);
                    pCVar7 = mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    if ((ulong)((long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) {
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        std::__throw_out_of_range_fmt
                                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,1);
LAB_0011b984:
                        prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  (prVar28,"incorrect number of multisig pubkeys");
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                      }
                      goto LAB_0011db6a;
                    }
                    buf._0_8_ = buf + 0x10;
                    strHexTx._M_dataplus._M_p = &DAT_00000020;
                    pbVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              buf;
                    buf._0_8_ = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                _M_create(pbVar25,(size_type *)&strHexTx,0);
                    buf._16_4_ = SUB84(strHexTx._M_dataplus._M_p,0);
                    buf[0x14] = (char)((ulong)strHexTx._M_dataplus._M_p >> 0x20);
                    buf._21_2_ = (undefined2)((ulong)strHexTx._M_dataplus._M_p >> 0x28);
                    buf[0x17] = (char)((ulong)strHexTx._M_dataplus._M_p >> 0x38);
                    builtin_strncpy((char *)buf._0_8_,"invalid multisig required number",0x20);
                    buf._8_8_ = strHexTx._M_dataplus._M_p;
                    *(buf._0_8_ + strHexTx._M_dataplus._M_p) = '\0';
                    _Var30 = strHexTx._M_dataplus;
                    uVar35 = TrimAndParse<unsigned_int>((string *)&(pCVar7->prevout).n,pbVar25);
                    if ((char *)buf._0_8_ != buf + 0x10) {
                      operator_delete((void *)buf._0_8_,
                                      CONCAT17(buf[0x17],
                                               CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_)))
                                      + 1);
                    }
                    pCVar7 = mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = (char)uVar35;
                    out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
                         (char)(uVar35 >> 8);
                    out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
                         (char)(uVar35 >> 0x10);
                    out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
                         (char)(uVar35 >> 0x18);
                    if ((ulong)((long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 3) {
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        auVar46 = std::__throw_out_of_range_fmt
                                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                             ,2);
                        goto LAB_0011ba84;
                      }
                      goto LAB_0011db6a;
                    }
                    buf._0_8_ = buf + 0x10;
                    strHexTx._M_dataplus._M_p = (pointer)0x1d;
                    buf._0_8_ = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)buf,(size_type *)&strHexTx,0);
                    buf._16_4_ = SUB84(strHexTx._M_dataplus._M_p,0);
                    buf[0x14] = (char)((ulong)strHexTx._M_dataplus._M_p >> 0x20);
                    buf._21_2_ = (undefined2)((ulong)strHexTx._M_dataplus._M_p >> 0x28);
                    buf[0x17] = (char)((ulong)strHexTx._M_dataplus._M_p >> 0x38);
                    builtin_strncpy((char *)buf._0_8_,"invalid multisig total number",0x1d);
                    buf._8_8_ = strHexTx._M_dataplus._M_p;
                    *(buf._0_8_ + strHexTx._M_dataplus._M_p) = '\0';
                    uVar35 = TrimAndParse<unsigned_int>
                                       ((string *)
                                        ((long)&(pCVar7->scriptSig).super_CScriptBase._union + 0x18)
                                        ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)buf);
                    if ((char *)buf._0_8_ != buf + 0x10) {
                      operator_delete((void *)buf._0_8_,
                                      CONCAT17(buf[0x17],
                                               CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_)))
                                      + 1);
                    }
                    numkeys = uVar35;
                    if ((ulong)((long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5) <
                        (ulong)(uVar35 + 3)) goto LAB_0011b984;
                    if ((((uint)out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_4_ <=
                          uVar35) && (0xffffffeb < uVar35 - 0x15)) &&
                       (0xffffffeb <
                        out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_4_ - 0x15)) {
                      prevtxsObj.typ = VNULL;
                      prevtxsObj._4_4_ = 0;
                      prevtxsObj.val._M_dataplus._M_p = (pointer)0x0;
                      prevtxsObj.val._M_string_length = 0;
                      lVar44 = 0;
                      do {
                        hex_str_00._M_str =
                             *(char **)((long)(&(mergedTx.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start)->prevout
                                              + 2) + lVar44 + 0x18);
                        hex_str_00._M_len =
                             *(size_t *)
                              (mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.
                               super_base_blob<256U>.m_data._M_elems + lVar44);
                        ParseHex<unsigned_char>
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &filename,hex_str_00);
                        CPubKey::Set<unsigned_char_const*>
                                  ((CPubKey *)buf,(uchar *)filename._M_dataplus._M_p,
                                   (uchar *)filename._M_string_length);
                        if (filename._M_dataplus._M_p != (pointer)0x0) {
                          operator_delete(filename._M_dataplus._M_p,
                                          CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                                                   CONCAT24(filename.field_2._M_allocated_capacity.
                                                            _4_2_,filename.field_2.
                                                                  _M_allocated_capacity._0_4_)) -
                                          (long)filename._M_dataplus._M_p);
                        }
                        bVar11 = CPubKey::IsFullyValid((CPubKey *)buf);
                        _Var30 = prevtxsObj.val._M_dataplus;
                        if (!bVar11) {
                          prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(prVar28,"invalid TX output pubkey");
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          goto LAB_0011db6a;
                        }
                        if (prevtxsObj.val._M_dataplus._M_p ==
                            (pointer)prevtxsObj.val._M_string_length) {
                          std::vector<CPubKey,std::allocator<CPubKey>>::
                          _M_realloc_insert<CPubKey_const&>
                                    ((vector<CPubKey,std::allocator<CPubKey>> *)&prevtxsObj,
                                     (iterator)prevtxsObj.val._M_dataplus._M_p,(CPubKey *)buf);
                        }
                        else {
                          memcpy(prevtxsObj.val._M_dataplus._M_p,buf,0x41);
                          prevtxsObj.val._M_dataplus._M_p = _Var30._M_p + 0x41;
                        }
                        lVar44 = lVar44 + 0x20;
                      } while ((ulong)uVar35 << 5 != lVar44);
                      uVar29 = (long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 5;
                      if (uVar29 == uVar35 + 4) {
                        buf._0_8_ = buf + 0x10;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)buf,
                                   *(long *)&mergedTx.vin.
                                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                             _M_impl.super__Vector_impl_data._M_finish[-1].nSequence
                                   ,(long)&((mergedTx.vin.
                                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                             _M_impl.super__Vector_impl_data._M_finish[-1].
                                             scriptWitness.stack.
                                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           )._M_impl +
                                    *(long *)&mergedTx.vin.
                                              super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                              _M_impl.super__Vector_impl_data._M_finish[-1].
                                              nSequence);
                        uVar4 = buf._8_8_;
                        uVar2 = buf._0_8_;
                        if (buf._8_8_ == 0) {
                          bVar37 = false;
                          bVar11 = false;
                        }
                        else {
                          pvVar14 = memchr((void *)buf._0_8_,0x57,buf._8_8_);
                          bVar37 = (long)pvVar14 - uVar2 != -1 && pvVar14 != (void *)0x0;
                          pvVar14 = memchr((void *)uVar2,0x53,uVar4);
                          bVar11 = (long)pvVar14 - uVar2 != -1 && pvVar14 != (void *)0x0;
                        }
                        if ((char *)uVar2 != buf + 0x10) {
                          operator_delete((void *)uVar2,
                                          CONCAT17(buf[0x17],
                                                   CONCAT25(buf._21_2_,
                                                            CONCAT14(buf[0x14],buf._16_4_))) + 1);
                        }
                      }
                      else {
                        if (uVar35 + 4 < uVar29) {
                          prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(prVar28,"Too many parameters");
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          goto LAB_0011db6a;
                        }
                        bVar37 = false;
                        bVar11 = false;
                      }
                      GetScriptForMultisig
                                ((CScript *)&filename,
                                 out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_4_,
                                 (vector<CPubKey,_std::allocator<CPubKey>_> *)&prevtxsObj);
                      pbVar16 = (byte *)prevtxsObj._0_8_;
                      if (bVar37) {
                        for (; pbVar16 != (byte *)prevtxsObj.val._M_dataplus._M_p;
                            pbVar16 = pbVar16 + 0x41) {
                          if ((*pbVar16 & 0xfe) != 2) {
                            prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (prVar28,
                                       "Uncompressed pubkeys are not useable for SegWit outputs");
                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                              __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            goto LAB_0011db6a;
                          }
                        }
                        WitnessV0ScriptHash::WitnessV0ScriptHash
                                  ((WitnessV0ScriptHash *)&valStr,(CScript *)&filename);
                        buf._8_8_ = valStr._M_string_length;
                        buf[0x10] = valStr.field_2._0_1_;
                        buf[0x11] = valStr.field_2._1_1_;
                        buf[0x12] = valStr.field_2._2_1_;
                        buf[0x13] = valStr.field_2._3_1_;
                        buf[0x14] = (char)valStr.field_2._M_allocated_capacity._4_4_;
                        buf._21_2_ = (undefined2)((uint)valStr.field_2._4_4_ >> 8);
                        buf._24_3_ = (undefined3)valStr.field_2._8_4_;
                        buf[0x17] = (char)((uint)valStr.field_2._4_4_ >> 0x18);
                        buf[0x1b] = (char)((uint)valStr.field_2._8_4_ >> 0x18);
                        buf._28_4_ = (undefined4)
                                     (CONCAT17(valStr.field_2._M_local_buf[0xf],
                                               CONCAT25(valStr.field_2._13_2_,
                                                        CONCAT14(valStr.field_2._M_local_buf[0xc],
                                                                 valStr.field_2._8_4_))) >> 0x20);
                        buf._0_8_ = valStr._M_dataplus._M_p;
                        buf[0x48] = '\x04';
                        GetScriptForDestination((CScript *)&strHexTx,(CTxDestination *)buf);
                        if (0x1c < (uint)filename.field_2._12_4_) {
                          free(filename._M_dataplus._M_p);
                        }
                        filename.field_2._M_allocated_capacity._0_4_ =
                             strHexTx.field_2._M_allocated_capacity._0_4_;
                        filename.field_2._M_allocated_capacity._4_2_ =
                             (undefined2)strHexTx.field_2._M_allocated_capacity._4_4_;
                        filename.field_2._M_allocated_capacity._6_2_ =
                             (undefined2)((uint)strHexTx.field_2._4_4_ >> 0x10);
                        filename.field_2._8_4_ = strHexTx.field_2._8_4_;
                        filename._M_dataplus = strHexTx._M_dataplus;
                        filename.field_2._12_4_ = strHexTx.field_2._12_4_;
                        strHexTx.field_2._12_4_ = 0;
                        filename._M_string_length = strHexTx._M_string_length;
                        std::__detail::__variant::
                        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                             *)buf);
                      }
                      if (bVar11) {
                        if (0x225 < (uint)filename.field_2._12_4_) {
                          prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                          uVar3 = filename.field_2._12_4_ + -0x1d;
                          if ((uint)filename.field_2._12_4_ < 0x1d) {
                            uVar3 = filename.field_2._12_4_;
                          }
                          strHexTx._M_dataplus._M_p._0_4_ = uVar3;
                          tinyformat::format<unsigned_int,unsigned_int>
                                    ((string *)buf,
                                     (tinyformat *)"redeemScript exceeds size limit: %d > %d",
                                     (char *)&strHexTx,&MAX_SCRIPT_ELEMENT_SIZE,(uint *)in_R8);
                          std::runtime_error::runtime_error(prVar28,(string *)buf);
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          goto LAB_0011db6a;
                        }
                        ScriptHash::ScriptHash((ScriptHash *)&valStr,(CScript *)&filename);
                        buf[0x10] = valStr.field_2._0_1_;
                        buf[0x11] = valStr.field_2._1_1_;
                        buf[0x12] = valStr.field_2._2_1_;
                        buf[0x13] = valStr.field_2._3_1_;
                        buf._8_8_ = valStr._M_string_length;
                        buf._0_8_ = valStr._M_dataplus._M_p;
                        buf[0x48] = '\x03';
                        GetScriptForDestination((CScript *)&strHexTx,(CTxDestination *)buf);
                        if (0x1c < (uint)filename.field_2._12_4_) {
                          free(filename._M_dataplus._M_p);
                        }
                        filename.field_2._M_allocated_capacity._0_4_ =
                             strHexTx.field_2._M_allocated_capacity._0_4_;
                        filename.field_2._M_allocated_capacity._4_2_ =
                             (undefined2)strHexTx.field_2._M_allocated_capacity._4_4_;
                        filename.field_2._M_allocated_capacity._6_2_ =
                             (undefined2)((uint)strHexTx.field_2._4_4_ >> 0x10);
                        filename.field_2._8_4_ = strHexTx.field_2._8_4_;
                        filename._M_dataplus = strHexTx._M_dataplus;
                        filename.field_2._12_4_ = strHexTx.field_2._12_4_;
                        strHexTx.field_2._12_4_ = 0;
                        filename._M_string_length = strHexTx._M_string_length;
                        std::__detail::__variant::
                        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                             *)buf);
                      }
                      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&strHexTx,
                                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&filename);
                      scriptPubKeyIn_02.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffe9b0;
                      scriptPubKeyIn_02.super_CScriptBase._union.indirect_contents.indirect =
                           in_stack_ffffffffffffe9a8._M_p;
                      scriptPubKeyIn_02.super_CScriptBase._union._16_8_ = in_stack_ffffffffffffe9b8;
                      scriptPubKeyIn_02.super_CScriptBase._24_8_ = in_stack_ffffffffffffe9c0;
                      CTxOut::CTxOut((CTxOut *)buf,(CAmount *)&txv,scriptPubKeyIn_02);
                      if (0x1c < (uint)strHexTx.field_2._12_4_) {
                        free(strHexTx._M_dataplus._M_p);
                        strHexTx._M_dataplus._M_p = (pointer)0x0;
                      }
                      std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                                (&tx.vout,(value_type *)buf);
                      if (0x1c < (uint)buf._36_4_) {
                        free((void *)buf._8_8_);
                      }
                      if (0x1c < (uint)filename.field_2._12_4_) {
                        free(filename._M_dataplus._M_p);
                      }
                      if (prevtxsObj._0_8_ == 0) goto LAB_001190ec;
                      uVar29 = prevtxsObj.val._M_string_length - prevtxsObj._0_8_;
                      _Var30._M_p = (pointer)prevtxsObj._0_8_;
LAB_001190e7:
                      operator_delete(_Var30._M_p,uVar29);
                      goto LAB_001190ec;
                    }
                    prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                    util::ToString<unsigned_int>((string *)&prevtxsObj,(uint *)&out);
                    std::operator+(&valStr,"multisig parameter mismatch. Required ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&prevtxsObj);
                    pbVar25 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              append(&valStr," of ");
                    strHexTx._M_dataplus._M_p = (pbVar25->_M_dataplus)._M_p;
                    paVar32 = &pbVar25->field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)strHexTx._M_dataplus._M_p == paVar32) {
                      uVar2 = *(undefined8 *)((long)&pbVar25->field_2 + 8);
                      strHexTx.field_2._M_allocated_capacity._0_4_ =
                           (undefined4)*(undefined8 *)paVar32;
                      strHexTx.field_2._M_allocated_capacity._4_4_ =
                           (undefined4)((ulong)*(undefined8 *)paVar32 >> 0x20);
                      strHexTx.field_2._8_4_ = (undefined4)uVar2;
                      strHexTx.field_2._12_4_ = (undefined4)((ulong)uVar2 >> 0x20);
                      strHexTx._M_dataplus._M_p = (pointer)&strHexTx.field_2;
                    }
                    else {
                      strHexTx.field_2._M_allocated_capacity._0_4_ =
                           (undefined4)*(undefined8 *)paVar32;
                      strHexTx.field_2._M_allocated_capacity._4_4_ =
                           (undefined4)((ulong)*(undefined8 *)paVar32 >> 0x20);
                    }
                    strHexTx._M_string_length._0_4_ = (undefined4)pbVar25->_M_string_length;
                    strHexTx._M_string_length._4_4_ =
                         (undefined4)(pbVar25->_M_string_length >> 0x20);
                    (pbVar25->_M_dataplus)._M_p = (pointer)paVar32;
                    pbVar25->_M_string_length = 0;
                    (pbVar25->field_2)._M_local_buf[0] = '\0';
                    util::ToString<unsigned_int>((string *)&types,&numkeys);
                    std::operator+(&filename,&strHexTx,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&types);
                    pbVar25 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              append(&filename,"signatures.");
                    buf._0_8_ = (pbVar25->_M_dataplus)._M_p;
                    paVar32 = &pbVar25->field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)buf._0_8_ == paVar32) {
                      uVar2 = *(undefined8 *)paVar32;
                      uVar4 = *(undefined8 *)((long)&pbVar25->field_2 + 8);
                      buf._16_4_ = (undefined4)uVar2;
                      buf[0x14] = (char)((ulong)uVar2 >> 0x20);
                      buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
                      buf[0x17] = (char)((ulong)uVar2 >> 0x38);
                      buf._24_3_ = (undefined3)uVar4;
                      buf[0x1b] = (char)((ulong)uVar4 >> 0x18);
                      buf._28_4_ = (undefined4)((ulong)uVar4 >> 0x20);
                      buf._0_8_ = buf + 0x10;
                    }
                    else {
                      uVar2 = *(undefined8 *)paVar32;
                      buf._16_4_ = (undefined4)uVar2;
                      buf[0x14] = (char)((ulong)uVar2 >> 0x20);
                      buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
                      buf[0x17] = (char)((ulong)uVar2 >> 0x38);
                    }
                    buf._8_8_ = pbVar25->_M_string_length;
                    (pbVar25->_M_dataplus)._M_p = (pointer)paVar32;
                    pbVar25->_M_string_length = 0;
                    (pbVar25->field_2)._M_local_buf[0] = '\0';
                    std::runtime_error::runtime_error(prVar28,(string *)buf);
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    goto LAB_0011db6a;
                  }
                  iVar12 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           compare(&key,"outscript");
                  if (iVar12 == 0) {
                    buf._0_8_ = value._M_dataplus._M_p;
                    buf[8] = (undefined1)value._M_string_length;
                    buf[9] = value._M_string_length._1_1_;
                    buf[10] = value._M_string_length._2_1_;
                    buf[0xb] = value._M_string_length._3_1_;
                    buf[0xc] = value._M_string_length._4_1_;
                    buf[0xd] = value._M_string_length._5_1_;
                    buf[0xe] = value._M_string_length._6_1_;
                    buf[0xf] = value._M_string_length._7_1_;
                    strHexTx._M_dataplus._M_p._0_1_ = 0x3a;
                    separators_03._M_str = (char *)in_R8;
                    separators_03._M_len = (size_t)&strHexTx;
                    util::Split<std::__cxx11::string>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&mergedTx,(util *)buf,(Span<const_char> *)0x1,separators_03);
                    if ((ulong)((long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start) < 0x21) {
                      prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar28,"TX output missing separator");
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      goto LAB_0011db6a;
                    }
                    types._M_t._M_impl._0_8_ =
                         ExtractAndValidateValue
                                   ((string *)
                                    mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                    filename._M_dataplus._M_p = (pointer)&filename.field_2;
                    lVar44 = *(long *)&((mergedTx.vin.
                                         super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                         super__Vector_impl_data._M_start)->prevout).n;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&filename,lVar44,
                               ((mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->scriptSig).
                               super_CScriptBase._union.indirect_contents.indirect + lVar44);
                    ParseScript((CScript *)&strHexTx,&filename);
                    if ((long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                        (long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                              .super__Vector_impl_data._M_start == 0x60) {
                      buf._0_8_ = buf + 0x10;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)buf,
                                 *(long *)&mergedTx.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_finish[-1].nSequence,
                                 (long)&((mergedTx.vin.
                                          super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                          super__Vector_impl_data._M_finish[-1].scriptWitness.stack.
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        )._M_impl +
                                 *(long *)&mergedTx.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_finish[-1].nSequence);
                      uVar4 = buf._8_8_;
                      uVar2 = buf._0_8_;
                      if (buf._8_8_ == 0) {
                        bVar37 = false;
                        bVar11 = true;
                      }
                      else {
                        pvVar14 = memchr((void *)buf._0_8_,0x57,buf._8_8_);
                        bVar37 = (long)pvVar14 - uVar2 != -1 && pvVar14 != (void *)0x0;
                        pvVar14 = memchr((void *)uVar2,0x53,uVar4);
                        bVar11 = (long)pvVar14 - uVar2 == -1 || pvVar14 == (void *)0x0;
                      }
                      if ((char *)uVar2 != buf + 0x10) {
                        operator_delete((void *)uVar2,
                                        CONCAT17(buf[0x17],
                                                 CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_))
                                                ) + 1);
                      }
                      if ((uint)strHexTx.field_2._12_4_ < 0x272e) {
                        if (bVar37) {
                          WitnessV0ScriptHash::WitnessV0ScriptHash
                                    ((WitnessV0ScriptHash *)&prevtxsObj,(CScript *)&strHexTx);
                          buf._16_4_ = (undefined4)prevtxsObj.val._M_string_length;
                          buf[0x14] = (char)(prevtxsObj.val._M_string_length >> 0x20);
                          buf._21_2_ = (undefined2)(prevtxsObj.val._M_string_length >> 0x28);
                          buf[0x17] = (char)(prevtxsObj.val._M_string_length >> 0x38);
                          buf._24_3_ = (undefined3)
                                       prevtxsObj.val.field_2._M_allocated_capacity._0_4_;
                          buf[0x1b] = (char)((uint)prevtxsObj.val.field_2._0_4_ >> 0x18);
                          buf[0x1c] = prevtxsObj.val.field_2._4_1_;
                          buf[0x1d] = prevtxsObj.val.field_2._5_1_;
                          buf[0x1e] = prevtxsObj.val.field_2._6_1_;
                          buf[0x1f] = prevtxsObj.val.field_2._7_1_;
                          buf._0_8_ = prevtxsObj._0_8_;
                          buf._8_8_ = prevtxsObj.val._M_dataplus._M_p;
                          buf[0x48] = '\x04';
                          GetScriptForDestination((CScript *)&valStr,(CTxDestination *)buf);
                          if (0x1c < (uint)strHexTx.field_2._12_4_) {
                            free(strHexTx._M_dataplus._M_p);
                          }
                          strHexTx.field_2._M_allocated_capacity._0_4_ =
                               valStr.field_2._M_allocated_capacity._0_4_;
                          strHexTx.field_2._M_allocated_capacity._4_4_ =
                               valStr.field_2._M_allocated_capacity._4_4_;
                          strHexTx.field_2._8_4_ = valStr.field_2._8_4_;
                          strHexTx._M_dataplus = valStr._M_dataplus;
                          strHexTx.field_2._12_4_ =
                               CONCAT13(valStr.field_2._M_local_buf[0xf],
                                        CONCAT21(valStr.field_2._13_2_,
                                                 valStr.field_2._M_local_buf[0xc]));
                          valStr.field_2._M_local_buf[0xc] = '\0';
                          valStr.field_2._13_2_ = 0;
                          valStr.field_2._M_local_buf[0xf] = '\0';
                          strHexTx._M_string_length = valStr._M_string_length;
                          std::__detail::__variant::
                          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                               *)buf);
                        }
                        if (!bVar11) {
                          if (0x225 < (uint)strHexTx.field_2._12_4_) {
                            prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                            uVar3 = strHexTx.field_2._12_4_ + -0x1d;
                            if ((uint)strHexTx.field_2._12_4_ < 0x1d) {
                              uVar3 = strHexTx.field_2._12_4_;
                            }
                            valStr._M_dataplus._M_p._0_4_ = uVar3;
                            tinyformat::format<unsigned_int,unsigned_int>
                                      ((string *)buf,
                                       (tinyformat *)"redeemScript exceeds size limit: %d > %d",
                                       (char *)&valStr,&MAX_SCRIPT_ELEMENT_SIZE,(uint *)in_R8);
                            std::runtime_error::runtime_error(prVar28,(string *)buf);
                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                              __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            goto LAB_0011db6a;
                          }
                          ScriptHash::ScriptHash((ScriptHash *)&prevtxsObj,(CScript *)&strHexTx);
                          sVar40 = prevtxsObj.val._M_string_length;
                          buf[0x10] = (char)prevtxsObj.val._M_string_length;
                          buf[0x11] = prevtxsObj.val._M_string_length._1_1_;
                          buf[0x12] = prevtxsObj.val._M_string_length._2_1_;
                          buf[0x13] = prevtxsObj.val._M_string_length._3_1_;
                          buf._0_8_ = prevtxsObj._0_8_;
                          buf._8_8_ = prevtxsObj.val._M_dataplus._M_p;
                          buf[0x48] = '\x03';
                          prevtxsObj.val._M_string_length = sVar40;
                          GetScriptForDestination((CScript *)&valStr,(CTxDestination *)buf);
                          if (0x1c < (uint)strHexTx.field_2._12_4_) {
                            free(strHexTx._M_dataplus._M_p);
                          }
                          strHexTx.field_2._M_allocated_capacity._0_4_ =
                               valStr.field_2._M_allocated_capacity._0_4_;
                          strHexTx.field_2._M_allocated_capacity._4_4_ =
                               valStr.field_2._M_allocated_capacity._4_4_;
                          strHexTx.field_2._8_4_ = valStr.field_2._8_4_;
                          strHexTx._M_dataplus = valStr._M_dataplus;
                          strHexTx.field_2._12_4_ =
                               CONCAT13(valStr.field_2._M_local_buf[0xf],
                                        CONCAT21(valStr.field_2._13_2_,
                                                 valStr.field_2._M_local_buf[0xc]));
                          valStr.field_2._M_local_buf[0xc] = '\0';
                          valStr.field_2._13_2_ = 0;
                          valStr.field_2._M_local_buf[0xf] = '\0';
                          strHexTx._M_string_length = valStr._M_string_length;
                          std::__detail::__variant::
                          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                               *)buf);
                        }
LAB_00119559:
                        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&valStr,
                                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&strHexTx);
                        scriptPubKeyIn_03.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffe9b0
                        ;
                        scriptPubKeyIn_03.super_CScriptBase._union.indirect_contents.indirect =
                             in_stack_ffffffffffffe9a8._M_p;
                        scriptPubKeyIn_03.super_CScriptBase._union._16_8_ =
                             in_stack_ffffffffffffe9b8;
                        scriptPubKeyIn_03.super_CScriptBase._24_8_ = in_stack_ffffffffffffe9c0;
                        CTxOut::CTxOut((CTxOut *)buf,(CAmount *)&types,scriptPubKeyIn_03);
                        if (0x1c < CONCAT13(valStr.field_2._M_local_buf[0xf],
                                            CONCAT21(valStr.field_2._13_2_,
                                                     valStr.field_2._M_local_buf[0xc]))) {
                          free(valStr._M_dataplus._M_p);
                          valStr._M_dataplus._M_p = (pointer)0x0;
                        }
                        std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                                  (&tx.vout,(value_type *)buf);
                        if (0x1c < (uint)buf._36_4_) {
                          free((void *)buf._8_8_);
                        }
                        if (0x1c < (uint)strHexTx.field_2._12_4_) {
                          free(strHexTx._M_dataplus._M_p);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)filename._M_dataplus._M_p != &filename.field_2) {
                          lVar44 = CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                                            CONCAT24(filename.field_2._M_allocated_capacity._4_2_,
                                                     filename.field_2._M_allocated_capacity._0_4_));
                          _Var30._M_p = filename._M_dataplus._M_p;
                          goto LAB_001181ed;
                        }
                        goto LAB_001190ec;
                      }
                    }
                    else if ((uint)strHexTx.field_2._12_4_ < 0x272e) goto LAB_00119559;
                    prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                    uVar3 = strHexTx.field_2._12_4_ + -0x1d;
                    if ((uint)strHexTx.field_2._12_4_ < 0x1d) {
                      uVar3 = strHexTx.field_2._12_4_;
                    }
                    valStr._M_dataplus._M_p._0_4_ = uVar3;
                    tinyformat::format<unsigned_int,int>
                              ((string *)buf,(tinyformat *)"script exceeds size limit: %d > %d",
                               (char *)&valStr,&MAX_SCRIPT_SIZE,(int *)in_R8);
                    std::runtime_error::runtime_error(prVar28,(string *)buf);
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    goto LAB_0011db6a;
                  }
                  iVar12 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           compare(&key,"outdata");
                  _Var30 = value._M_dataplus;
                  if (iVar12 == 0) {
                    mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    if (value._M_string_length == 0) {
LAB_00118a02:
                      sVar40 = 0;
                    }
                    else {
                      pvVar14 = memchr(value._M_dataplus._M_p,0x3a,value._M_string_length);
                      if ((pvVar14 == (void *)0x0) ||
                         (sVar40 = (long)pvVar14 - (long)_Var30._M_p, sVar40 == 0xffffffffffffffff))
                      goto LAB_00118a02;
                      if (sVar40 == 0) {
                        prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar28,"TX output value not specified");
                        goto LAB_0011b555;
                      }
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)buf,&value,0,sVar40);
                      mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           (pointer)ExtractAndValidateValue((string *)buf);
                      if ((char *)buf._0_8_ != buf + 0x10) {
                        operator_delete((void *)buf._0_8_,
                                        CONCAT17(buf[0x17],
                                                 CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_))
                                                ) + 1);
                      }
                      sVar40 = sVar40 + 1;
                    }
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::substr(&strHexTx,&value,sVar40,0xffffffffffffffff);
                    str_07._M_str = strHexTx._M_dataplus._M_p;
                    str_07._M_len = strHexTx._M_string_length;
                    bVar11 = IsHex(str_07);
                    if (!bVar11) {
                      prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar28,"invalid TX output data");
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      goto LAB_0011db6a;
                    }
                    hex_str_01._M_str = strHexTx._M_dataplus._M_p;
                    hex_str_01._M_len = strHexTx._M_string_length;
                    ParseHex<unsigned_char>
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&prevtxsObj,
                               hex_str_01);
                    filename.field_2._M_allocated_capacity._0_4_ = 0;
                    filename.field_2._M_allocated_capacity._4_2_ = 0;
                    filename.field_2._M_allocated_capacity._6_2_ = 0;
                    filename.field_2._8_4_ = 0;
                    filename.field_2._12_4_ = 0;
                    filename._M_dataplus._M_p = (pointer)0x0;
                    filename._M_string_length._0_4_ = 0;
                    filename._M_string_length._4_4_ = 0;
                    valStr._M_dataplus._M_p._0_1_ = 0x6a;
                    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&filename,
                               (iterator)&filename,(uchar *)&valStr);
                    other = &CScript::operator<<((CScript *)&filename,
                                                 (vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&prevtxsObj)->super_CScriptBase;
                    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&valStr,other);
                    scriptPubKeyIn_00.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffe9b0;
                    scriptPubKeyIn_00.super_CScriptBase._union.indirect_contents.indirect =
                         in_stack_ffffffffffffe9a8._M_p;
                    scriptPubKeyIn_00.super_CScriptBase._union._16_8_ = in_stack_ffffffffffffe9b8;
                    scriptPubKeyIn_00.super_CScriptBase._24_8_ = in_stack_ffffffffffffe9c0;
                    CTxOut::CTxOut((CTxOut *)buf,(CAmount *)&mergedTx,scriptPubKeyIn_00);
                    if (0x1c < CONCAT13(valStr.field_2._M_local_buf[0xf],
                                        CONCAT21(valStr.field_2._13_2_,
                                                 valStr.field_2._M_local_buf[0xc]))) {
                      free(valStr._M_dataplus._M_p);
                      valStr._M_dataplus._M_p = (pointer)0x0;
                    }
                    if (0x1c < (uint)filename.field_2._12_4_) {
                      free(filename._M_dataplus._M_p);
                    }
                    std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                              (&tx.vout,(value_type *)buf);
                    if (0x1c < (uint)buf._36_4_) {
                      free((void *)buf._8_8_);
                    }
                    if (prevtxsObj._0_8_ != 0) {
                      uVar29 = prevtxsObj.val._M_string_length - prevtxsObj._0_8_;
                      _Var30._M_p = (pointer)prevtxsObj._0_8_;
LAB_00119363:
                      operator_delete(_Var30._M_p,uVar29);
                    }
LAB_00119368:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)strHexTx._M_dataplus._M_p == &strHexTx.field_2) goto LAB_001190f9;
                    lVar44 = CONCAT44(strHexTx.field_2._M_allocated_capacity._4_4_,
                                      strHexTx.field_2._M_allocated_capacity._0_4_);
                    _Var30._M_p = strHexTx._M_dataplus._M_p;
                  }
                  else {
                    iVar12 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             compare(&key,"sign");
                    if (iVar12 == 0) {
                      pEVar15 = (ECC_Context *)operator_new(1);
                      ECC_Context::ECC_Context(pEVar15);
                      _Var8._M_head_impl = local_15c0._M_head_impl;
                      bVar11 = local_15c0._M_head_impl != (ECC_Context *)0x0;
                      local_15c0._M_head_impl = pEVar15;
                      if (bVar11) {
                        ECC_Context::~ECC_Context(_Var8._M_head_impl);
                        operator_delete(_Var8._M_head_impl,1);
                      }
                      if (value._M_string_length == 0) {
                        in_stack_ffffffffffffe9d4 = 1;
                      }
                      else {
                        iVar12 = std::__cxx11::
                                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                 compare(&value,"DEFAULT");
                        paVar42 = sighashOptions;
                        if (iVar12 != 0) {
                          lVar44 = 0;
                          do {
                            lVar31 = lVar44;
                            if (lVar31 + 0x10 == 0x70) {
                              prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        (prVar28,"unknown sighash flag/sign option");
                              goto LAB_0011b555;
                            }
                            iVar12 = std::__cxx11::
                                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     ::compare(&value,*(char **)((long)&sighashOptions[1].flagStr +
                                                                lVar31));
                            lVar44 = lVar31 + 0x10;
                          } while (iVar12 != 0);
                          paVar42 = (anon_struct_16_2_9739c62b *)(lVar31 + 0x3d80b0);
                        }
                        in_stack_ffffffffffffe9d4 = paVar42->flags;
                      }
                      std::vector<CTxIn,_std::allocator<CTxIn>_>::vector(&mergedTx.vin,&tx.vin);
                      std::vector<CTxOut,_std::allocator<CTxOut>_>::vector(&mergedTx.vout,&tx.vout);
                      mergedTx.version = tx.version;
                      mergedTx.nLockTime = tx.nLockTime;
                      std::vector<CTxIn,_std::allocator<CTxIn>_>::vector(&txv.vin,&tx.vin);
                      std::vector<CTxOut,_std::allocator<CTxOut>_>::vector(&txv.vout,&tx.vout);
                      txv.version = tx.version;
                      txv.nLockTime = tx.nLockTime;
                      viewDummy._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_003d82c8;
                      CCoinsViewCache::CCoinsViewCache
                                ((CCoinsViewCache *)&filename,&viewDummy,false);
                      buf[0x10] = 'p';
                      buf[0x11] = 'r';
                      buf[0x12] = 'i';
                      buf[0x13] = 'v';
                      buf[0x14] = 'a';
                      buf[0x15] = 't';
                      buf[0x16] = 'e';
                      buf[0x17] = 'k';
                      buf[0x18] = 'e';
                      buf[0x19] = 'y';
                      buf[0x1a] = 's';
                      buf[8] = '\v';
                      buf[9] = '\0';
                      buf[10] = '\0';
                      buf[0xb] = '\0';
                      buf[0xc] = '\0';
                      buf[0xd] = '\0';
                      buf[0xe] = '\0';
                      buf[0xf] = '\0';
                      buf[0x1b] = '\0';
                      buf._0_8_ = buf + 0x10;
                      cVar18 = std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                               ::find(&registers_abi_cxx11_._M_t,(key_type *)buf);
                      if ((char *)buf._0_8_ != buf + 0x10) {
                        operator_delete((void *)buf._0_8_,
                                        CONCAT17(buf[0x17],
                                                 CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_))
                                                ) + 1);
                      }
                      if ((_Rb_tree_header *)cVar18._M_node ==
                          &registers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                        prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  (prVar28,"privatekeys register variable must be set.");
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                      }
                      else {
                        strHexTx.field_2._M_allocated_capacity._0_4_ = 0;
                        strHexTx.field_2._8_4_ = 0;
                        strHexTx.field_2._12_4_ = 0;
                        local_260._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                        local_260._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
                        ;
                        local_260._M_impl.super__Rb_tree_header._M_header._M_left =
                             &local_260._M_impl.super__Rb_tree_header._M_header;
                        _Stack_230.__data.__list.__prev = (__pthread_internal_list *)0x0;
                        _Stack_230.__data.__list.__next = (__pthread_internal_list *)0x0;
                        _Stack_230._8_8_ = 0;
                        local_260._M_impl.super__Rb_tree_header._M_node_count = 0;
                        _Stack_230.__align = 0;
                        _Stack_230._16_8_ = 1;
                        buf._0_8_ = buf + 0x10;
                        buf[0x10] = 'p';
                        buf[0x11] = 'r';
                        buf[0x12] = 'i';
                        buf[0x13] = 'v';
                        buf[0x14] = 'a';
                        buf[0x15] = 't';
                        buf[0x16] = 'e';
                        buf[0x17] = 'k';
                        buf[0x18] = 'e';
                        buf[0x19] = 'y';
                        buf[0x1a] = 's';
                        buf[8] = '\v';
                        buf[9] = '\0';
                        buf[10] = '\0';
                        buf[0xb] = '\0';
                        buf[0xc] = '\0';
                        buf[0xd] = '\0';
                        buf[0xe] = '\0';
                        buf[0xf] = '\0';
                        buf[0x1b] = '\0';
                        strHexTx._M_dataplus._M_p = (pointer)ppuVar47;
                        local_260._M_impl.super__Rb_tree_header._M_header._M_right =
                             local_260._M_impl.super__Rb_tree_header._M_header._M_left;
                        pmVar19 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                  ::operator[](&registers_abi_cxx11_,(key_type *)buf);
                        valStr._M_dataplus._M_p._0_4_ = pmVar19->typ;
                        valStr._M_string_length = (long)&valStr.field_2 + 8;
                        pcVar38 = (pmVar19->val)._M_dataplus._M_p;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&valStr._M_string_length,pcVar38,
                                   pcVar38 + (pmVar19->val)._M_string_length);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::vector(&local_2c8,&pmVar19->keys);
                        std::vector<UniValue,_std::allocator<UniValue>_>::vector
                                  (&local_2b0,&pmVar19->values);
                        if ((char *)buf._0_8_ != buf + 0x10) {
                          operator_delete((void *)buf._0_8_,
                                          CONCAT17(buf[0x17],
                                                   CONCAT25(buf._21_2_,
                                                            CONCAT14(buf[0x14],buf._16_4_))) + 1);
                        }
                        if (local_2b0.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                            _M_impl.super__Vector_impl_data._M_finish !=
                            local_2b0.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                            _M_impl.super__Vector_impl_data._M_start) {
                          uVar35 = 1;
                          sVar43 = 0;
                          do {
                            pUVar20 = UniValue::operator[]((UniValue *)&valStr,sVar43);
                            if (pUVar20->typ != VSTR) {
                              prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        (prVar28,"privatekey not a std::string");
                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              goto LAB_0011db6a;
                            }
                            UniValue::operator[]((UniValue *)&valStr,sVar43);
                            DecodeSecret((string *)&prevtxsObj);
                            if (prevtxsObj.val._M_dataplus._M_p == (pointer)0x0) {
                              prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error(prVar28,"privatekey not valid");
                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              goto LAB_0011db6a;
                            }
                            CKey::GetPubKey((CPubKey *)buf,(CKey *)&prevtxsObj);
                            (**(code **)(strHexTx._M_dataplus._M_p + 0x50))
                                      (&strHexTx,&prevtxsObj,(CPubKey *)buf);
                            if (prevtxsObj.val._M_dataplus._M_p != (pointer)0x0) {
                              SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                                        ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
                                         &prevtxsObj.val,
                                         (array<unsigned_char,_32UL> *)
                                         prevtxsObj.val._M_dataplus._M_p);
                            }
                            sVar43 = (size_t)uVar35;
                            uVar29 = ((long)local_2b0.
                                            super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_2b0.
                                            super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 3) *
                                     0x2e8ba2e8ba2e8ba3;
                            uVar35 = uVar35 + 1;
                          } while (sVar43 <= uVar29 && uVar29 - sVar43 != 0);
                        }
                        builtin_strncpy(buf + 0x10,"prevtxs",7);
                        buf[8] = '\a';
                        buf[9] = '\0';
                        buf[10] = '\0';
                        buf[0xb] = '\0';
                        buf[0xc] = '\0';
                        buf[0xd] = '\0';
                        buf[0xe] = '\0';
                        buf[0xf] = '\0';
                        buf._23_4_ = buf._23_4_ & 0xffffff00;
                        buf._0_8_ = buf + 0x10;
                        cVar18 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                 ::find(&registers_abi_cxx11_._M_t,(key_type *)buf);
                        if ((char *)buf._0_8_ != buf + 0x10) {
                          operator_delete((void *)buf._0_8_,
                                          CONCAT17(buf[0x17],
                                                   CONCAT25(buf._21_2_,
                                                            CONCAT14(buf[0x14],buf._16_4_))) + 1);
                        }
                        if ((_Rb_tree_header *)cVar18._M_node !=
                            &registers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                          buf._0_8_ = buf + 0x10;
                          builtin_strncpy(buf + 0x10,"prevtxs",7);
                          buf[8] = '\a';
                          buf[9] = '\0';
                          buf[10] = '\0';
                          buf[0xb] = '\0';
                          buf[0xc] = '\0';
                          buf[0xd] = '\0';
                          buf[0xe] = '\0';
                          buf[0xf] = '\0';
                          buf._23_4_ = buf._23_4_ & 0xffffff00;
                          pmVar19 = std::
                                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                    ::operator[](&registers_abi_cxx11_,(key_type *)buf);
                          prevtxsObj.typ = pmVar19->typ;
                          prevtxsObj.val._M_dataplus._M_p = (pointer)&prevtxsObj.val.field_2;
                          pcVar38 = (pmVar19->val)._M_dataplus._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&prevtxsObj.val,pcVar38,
                                     pcVar38 + (pmVar19->val)._M_string_length);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::vector(&prevtxsObj.keys,&pmVar19->keys);
                          std::vector<UniValue,_std::allocator<UniValue>_>::vector
                                    (&prevtxsObj.values,&pmVar19->values);
                          if ((char *)buf._0_8_ != buf + 0x10) {
                            operator_delete((void *)buf._0_8_,
                                            CONCAT17(buf[0x17],
                                                     CONCAT25(buf._21_2_,
                                                              CONCAT14(buf[0x14],buf._16_4_))) + 1);
                          }
                          if (prevtxsObj.values.
                              super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                              super__Vector_impl_data._M_finish !=
                              prevtxsObj.values.
                              super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                              super__Vector_impl_data._M_start) {
                            sVar43 = 0;
                            do {
                              pUVar20 = UniValue::operator[](&prevtxsObj,sVar43);
                              if (pUVar20->typ != VOBJ) {
                                prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          (prVar28,"expected prevtxs internal object");
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                  __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                                goto LAB_0011db6a;
                              }
                              buf._0_8_ = buf + 0x10;
                              buf[0x10] = 't';
                              buf[0x11] = 'x';
                              buf[0x12] = 'i';
                              buf[0x13] = 'd';
                              buf[8] = '\x04';
                              buf[9] = '\0';
                              buf[10] = '\0';
                              buf[0xb] = '\0';
                              buf[0xc] = '\0';
                              buf[0xd] = '\0';
                              buf[0xe] = '\0';
                              buf[0xf] = '\0';
                              buf[0x14] = '\0';
                              buf[0x20] = '\x03';
                              buf[0x21] = '\0';
                              buf[0x22] = '\0';
                              buf[0x23] = '\0';
                              buf._40_8_ = buf + 0x38;
                              buf[0x38] = 'v';
                              buf[0x39] = 'o';
                              buf[0x3a] = 'u';
                              buf[0x3b] = 't';
                              buf[0x30] = '\x04';
                              buf[0x31] = '\0';
                              buf[0x32] = '\0';
                              buf[0x33] = '\0';
                              buf[0x34] = '\0';
                              buf[0x35] = '\0';
                              buf[0x36] = '\0';
                              buf[0x37] = '\0';
                              buf[0x3c] = '\0';
                              buf[0x48] = '\x04';
                              buf[0x49] = '\0';
                              buf[0x4a] = '\0';
                              buf[0x4b] = '\0';
                              plVar36 = (long *)(buf + 0x60);
                              buf[0x60] = 's';
                              buf[0x61] = 'c';
                              buf[0x62] = 'r';
                              buf[99] = 'i';
                              buf[100] = 'p';
                              buf[0x65] = 't';
                              buf[0x66] = 'P';
                              buf[0x67] = 'u';
                              buf[0x68] = 'b';
                              buf[0x69] = 'K';
                              buf[0x6a] = 'e';
                              buf[0x6b] = 'y';
                              buf[0x58] = '\f';
                              buf[0x59] = '\0';
                              buf[0x5a] = '\0';
                              buf[0x5b] = '\0';
                              buf[0x5c] = '\0';
                              buf[0x5d] = '\0';
                              buf[0x5e] = '\0';
                              buf[0x5f] = '\0';
                              buf._108_4_ = buf._108_4_ & 0xffffff00;
                              buf[0x70] = '\x03';
                              buf[0x71] = '\0';
                              buf[0x72] = '\0';
                              buf[0x73] = '\0';
                              __comp = &out;
                              in_R8 = (allocator_type *)&numkeys;
                              __l._M_len = 3;
                              __l._M_array = (iterator)buf;
                              buf._80_8_ = plVar36;
                              std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
                              ::map(&types,__l,
                                    (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)__comp,in_R8);
                              lVar44 = -0x78;
                              do {
                                if (plVar36 != (long *)plVar36[-2]) {
                                  operator_delete((long *)plVar36[-2],*plVar36 + 1);
                                }
                                plVar36 = plVar36 + -5;
                                lVar44 = lVar44 + 0x28;
                              } while (lVar44 != 0);
                              bVar11 = UniValue::checkObject(pUVar20,&types);
                              if (!bVar11) {
                                prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          (prVar28,"prevtxs internal object typecheck fail");
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                  __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                                goto LAB_0011db6a;
                              }
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
                                   out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10;
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\x04';
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = 't';
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = 'x';
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = 'i';
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = 'd';
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
                              pUVar21 = UniValue::operator[](pUVar20,(string *)&out);
                              psVar22 = UniValue::get_str_abi_cxx11_(pUVar21);
                              str_00._M_str = (char *)__comp;
                              str_00._M_len = (size_t)(psVar22->_M_dataplus)._M_p;
                              detail::FromHex<uint256>
                                        ((optional<uint256> *)buf,
                                         (detail *)psVar22->_M_string_length,str_00);
                              uVar3 = buf._23_4_;
                              cVar9 = buf[0x20];
                              if (buf[0x20] == '\x01') {
                                local_358[4] = buf[0x14];
                                local_358[0] = buf[0x10];
                                local_358[1] = buf[0x11];
                                local_358[2] = buf[0x12];
                                local_358[3] = buf[0x13];
                                local_358[5] = buf[0x15];
                                local_358[6] = buf[0x16];
                                local_358[7] = buf[0x17];
                                auStack_350[3] = buf[0x1b];
                                auStack_350[0] = buf[0x18];
                                auStack_350[1] = buf[0x19];
                                auStack_350[2] = buf[0x1a];
                                auStack_350[4] = buf[0x1c];
                                auStack_350[5] = buf[0x1d];
                                auStack_350[6] = buf[0x1e];
                                auStack_350[7] = buf[0x1f];
                                numkeys._0_1_ = buf[0];
                                numkeys._1_1_ = buf[1];
                                numkeys._2_1_ = buf[2];
                                numkeys._3_1_ = buf[3];
                                cStack_364 = buf[4];
                                cStack_363 = buf[5];
                                cStack_362 = buf[6];
                                cStack_361 = buf[7];
                                acStack_360[0] = buf[8];
                                acStack_360[1] = buf[9];
                                acStack_360[2] = buf[10];
                                acStack_360[3] = buf[0xb];
                                acStack_360[4] = buf[0xc];
                                acStack_360[5] = buf[0xd];
                                acStack_360[6] = buf[0xe];
                                acStack_360[7] = buf[0xf];
                              }
                              buf._23_4_ = uVar3;
                              if ((uchar *)out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems.
                                           _0_8_ !=
                                  out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) {
                                operator_delete((void *)out.hash.m_wrapped.super_base_blob<256U>.
                                                        m_data._M_elems._0_8_,
                                                out.hash.m_wrapped.super_base_blob<256U>.m_data.
                                                _M_elems._16_8_ + 1);
                              }
                              if (cVar9 == '\0') {
                                prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                                local_388._0_8_ = local_388 + 0x10;
                                local_388._8_8_ = 4;
                                local_388._16_5_ = 0x64697874;
                                pUVar20 = UniValue::operator[](pUVar20,(string *)local_388);
                                psVar22 = UniValue::get_str_abi_cxx11_(pUVar20);
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&out,"txid must be hexadecimal string (not \'",
                                               psVar22);
                                pbVar25 = std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          ::append((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&out,"\')");
                                buf._0_8_ = (pbVar25->_M_dataplus)._M_p;
                                paVar32 = &pbVar25->field_2;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)buf._0_8_ == paVar32) {
                                  uVar2 = *(undefined8 *)paVar32;
                                  uVar4 = *(undefined8 *)((long)&pbVar25->field_2 + 8);
                                  buf._16_4_ = (undefined4)uVar2;
                                  buf[0x14] = (char)((ulong)uVar2 >> 0x20);
                                  buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
                                  buf[0x17] = (char)((ulong)uVar2 >> 0x38);
                                  buf._24_3_ = (undefined3)uVar4;
                                  buf[0x1b] = (char)((ulong)uVar4 >> 0x18);
                                  buf._28_4_ = (undefined4)((ulong)uVar4 >> 0x20);
                                  buf._0_8_ = buf + 0x10;
                                }
                                else {
                                  uVar2 = *(undefined8 *)paVar32;
                                  buf._16_4_ = (undefined4)uVar2;
                                  buf[0x14] = (char)((ulong)uVar2 >> 0x20);
                                  buf._21_2_ = (undefined2)((ulong)uVar2 >> 0x28);
                                  buf[0x17] = (char)((ulong)uVar2 >> 0x38);
                                }
                                buf._8_8_ = pbVar25->_M_string_length;
                                (pbVar25->_M_dataplus)._M_p = (pointer)paVar32;
                                pbVar25->_M_string_length = 0;
                                (pbVar25->field_2)._M_local_buf[0] = '\0';
                                std::runtime_error::runtime_error(prVar28,(string *)buf);
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                  __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                                goto LAB_0011db6a;
                              }
                              buf._0_8_ = buf + 0x10;
                              builtin_strncpy(buf + 0x10,"vout",5);
                              buf[8] = '\x04';
                              buf[9] = '\0';
                              buf[10] = '\0';
                              buf[0xb] = '\0';
                              buf[0xc] = '\0';
                              buf[0xd] = '\0';
                              buf[0xe] = '\0';
                              buf[0xf] = '\0';
                              pUVar21 = UniValue::operator[](pUVar20,(string *)buf);
                              uVar13 = UniValue::getInt<int>(pUVar21);
                              if ((char *)buf._0_8_ != buf + 0x10) {
                                operator_delete((void *)buf._0_8_,
                                                CONCAT17(buf[0x17],
                                                         CONCAT25(buf._21_2_,
                                                                  CONCAT14(buf[0x14],buf._16_4_))) +
                                                1);
                              }
                              if ((int)uVar13 < 0) {
                                prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error(prVar28,"vout cannot be negative")
                                ;
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                  __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                                goto LAB_0011db6a;
                              }
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
                                   local_358[0];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
                                   local_358[1];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
                                   local_358[2];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
                                   local_358[3];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
                                   local_358[4];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
                                   local_358[5];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
                                   local_358[6];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
                                   local_358[7];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
                                   auStack_350[0];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
                                   auStack_350[1];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
                                   auStack_350[2];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
                                   auStack_350[3];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
                                   auStack_350[4];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
                                   auStack_350[5];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
                                   auStack_350[6];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
                                   auStack_350[7];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
                                   (char)numkeys;
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
                                   numkeys._1_1_;
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
                                   numkeys._2_1_;
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
                                   numkeys._3_1_;
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
                                   cStack_364;
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
                                   cStack_363;
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
                                   cStack_362;
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
                                   cStack_361;
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
                                   acStack_360[0];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
                                   acStack_360[1];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
                                   acStack_360[2];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
                                   acStack_360[3];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
                                   acStack_360[4];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
                                   acStack_360[5];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
                                   acStack_360[6];
                              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
                                   acStack_360[7];
                              buf._0_8_ = buf + 0x10;
                              buf[0x10] = 's';
                              buf[0x11] = 'c';
                              buf[0x12] = 'r';
                              buf[0x13] = 'i';
                              buf[0x14] = 'p';
                              buf[0x15] = 't';
                              buf[0x16] = 'P';
                              buf[0x17] = 'u';
                              buf[0x18] = 'b';
                              buf[0x19] = 'K';
                              buf[0x1a] = 'e';
                              buf[0x1b] = 'y';
                              buf[8] = '\f';
                              buf[9] = '\0';
                              buf[10] = '\0';
                              buf[0xb] = '\0';
                              buf[0xc] = '\0';
                              buf[0xd] = '\0';
                              buf[0xe] = '\0';
                              buf[0xf] = '\0';
                              buf._28_4_ = buf._28_4_ & 0xffffff00;
                              out.n = uVar13;
                              pUVar21 = UniValue::operator[](pUVar20,(string *)buf);
                              local_388._16_8_ = 0x7550747069726373;
                              local_388._24_4_ = 0x79654b62;
                              local_388._8_8_ = 0xc;
                              local_388._28_4_ = local_388._28_4_ & 0xffffff00;
                              local_388._0_8_ = local_388 + 0x10;
                              ParseHexUV(&pkData,pUVar21,(string *)local_388);
                              if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                                operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                              }
                              if ((char *)buf._0_8_ != buf + 0x10) {
                                operator_delete((void *)buf._0_8_,
                                                CONCAT17(buf[0x17],
                                                         CONCAT25(buf._21_2_,
                                                                  CONCAT14(buf[0x14],buf._16_4_))) +
                                                1);
                              }
                              prevector<28U,_unsigned_char,_unsigned_int,_int>::
                              prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                         local_388,
                                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          )pkData.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          )pkData.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish);
                              pCVar23 = CCoinsViewCache::AccessCoin
                                                  ((CCoinsViewCache *)&filename,&out);
                              if ((pCVar23->out).nValue != -1) {
                                pCVar45 = &(pCVar23->out).scriptPubKey;
                                bVar11 = prevector<28U,_unsigned_char,_unsigned_int,_int>::
                                         operator==(&pCVar45->super_CScriptBase,
                                                    (
                                                  prevector<28U,_unsigned_char,_unsigned_int,_int> *
                                                  )local_388);
                                if (!bVar11) {
                                  buf._0_8_ = buf + 0x10;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)buf,
                                             "Previous output scriptPubKey mismatch:\n","");
                                  ScriptToAsmStr_abi_cxx11_(&local_438,pCVar45,false);
                                  std::operator+(&local_418,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)buf,&local_438);
                                  pbVar25 = std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            ::append(&local_418,"\nvs:\n");
                                  i = (size_t)(pbVar25->_M_dataplus)._M_p;
                                  paVar32 = &pbVar25->field_2;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)i == paVar32) {
                                    local_3e8._M_allocated_capacity = paVar32->_M_allocated_capacity
                                    ;
                                    local_3e8._8_8_ = *(undefined8 *)((long)&pbVar25->field_2 + 8);
                                    i = (size_t)&local_3e8;
                                  }
                                  else {
                                    local_3e8._M_allocated_capacity = paVar32->_M_allocated_capacity
                                    ;
                                  }
                                  local_3f0._M_current = (uchar *)pbVar25->_M_string_length;
                                  (pbVar25->_M_dataplus)._M_p = (pointer)paVar32;
                                  pbVar25->_M_string_length = 0;
                                  (pbVar25->field_2)._M_local_buf[0] = '\0';
                                  ScriptToAsmStr_abi_cxx11_(&local_458,(CScript *)local_388,false);
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&i_1,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&i,&local_458);
                                  std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)buf,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&i_1);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)i_1 != &local_3c8) {
                                    operator_delete((void *)i_1,local_3c8._M_allocated_capacity + 1)
                                    ;
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_458._M_dataplus._M_p != &local_458.field_2) {
                                    operator_delete(local_458._M_dataplus._M_p,
                                                    local_458.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)i != &local_3e8) {
                                    operator_delete((void *)i,
                                                    (ulong)(local_3e8._M_allocated_capacity + 1));
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                                    operator_delete(local_418._M_dataplus._M_p,
                                                    local_418.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_438._M_dataplus._M_p != &local_438.field_2) {
                                    operator_delete(local_438._M_dataplus._M_p,
                                                    local_438.field_2._M_allocated_capacity + 1);
                                  }
                                  prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error(prVar28,(string *)buf);
                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                    __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                                std::runtime_error::~runtime_error);
                                  }
                                  goto LAB_0011db6a;
                                }
                              }
                              CTxOut::CTxOut((CTxOut *)buf);
                              buf._40_8_ = buf._40_8_ & 0xffffffff00000000;
                              prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                         (buf + 8),
                                         (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                         local_388);
                              buf[0] = '\0';
                              buf[1] = '@';
                              buf[2] = '\a';
                              buf[3] = 'Z';
                              buf[4] = -0x10;
                              buf[5] = 'u';
                              buf[6] = '\a';
                              buf[7] = '\0';
                              local_3d0 = 6;
                              local_3c8._M_allocated_capacity._0_7_ = 0x746e756f6d61;
                              i_1 = (size_t)&local_3c8;
                              bVar11 = UniValue::findKey(pUVar20,(string *)&i_1,&i);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)i_1 != &local_3c8) {
                                operator_delete((void *)i_1,local_3c8._M_allocated_capacity + 1);
                              }
                              if (bVar11) {
                                i_1 = (size_t)&local_3c8;
                                local_3d0 = 6;
                                local_3c8._M_allocated_capacity._0_7_ = 0x746e756f6d61;
                                pUVar21 = UniValue::operator[](pUVar20,(string *)&i_1);
                                if (pUVar21->typ - VSTR < 2) {
                                  val._M_str = (pUVar21->val)._M_dataplus._M_p;
                                  val._M_len = (pUVar21->val)._M_string_length;
                                  bVar11 = ParseFixedPoint(val,8,(int64_t *)&i);
                                  if (bVar11) {
                                    if (i < 0x775f05a074001) {
                                      buf[0] = (undefined1)i;
                                      buf[1] = i._1_1_;
                                      buf[2] = i._2_1_;
                                      buf[3] = i._3_1_;
                                      buf[4] = i._4_1_;
                                      buf[5] = i._5_1_;
                                      buf[6] = i._6_1_;
                                      buf[7] = i._7_1_;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)i_1 != &local_3c8) {
                                        operator_delete((void *)i_1,
                                                        local_3c8._M_allocated_capacity + 1);
                                      }
                                      goto LAB_00119fc8;
                                    }
                                    prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error(prVar28,"Amount out of range")
                                    ;
                                  }
                                  else {
                                    prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error(prVar28,"Invalid amount");
                                  }
                                }
                                else {
                                  prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            (prVar28,"Amount is not a number or string");
                                }
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                  __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                                goto LAB_0011db6a;
                              }
LAB_00119fc8:
                              buf._40_8_ = buf._40_8_ & 0xffffffff00000001 | 2;
                              CCoinsViewCache::AddCoin
                                        ((CCoinsViewCache *)&filename,&out,(Coin *)buf,true);
                              if (0x1c < (uint)buf._36_4_) {
                                free((void *)buf._8_8_);
                              }
                              bVar11 = CScript::IsPayToScriptHash((CScript *)local_388);
                              if (bVar11) {
LAB_0011a03b:
                                buf[0x10] = 'r';
                                buf[0x11] = 'e';
                                buf[0x12] = 'd';
                                buf[0x13] = 'e';
                                buf[0x14] = 'e';
                                buf[0x15] = 'm';
                                buf[0x16] = 'S';
                                buf[0x17] = 'c';
                                buf[0x18] = 'r';
                                buf[0x19] = 'i';
                                buf[0x1a] = 'p';
                                buf[0x1b] = 't';
                                buf[8] = '\f';
                                buf[9] = '\0';
                                buf[10] = '\0';
                                buf[0xb] = '\0';
                                buf[0xc] = '\0';
                                buf[0xd] = '\0';
                                buf[0xe] = '\0';
                                buf[0xf] = '\0';
                                buf._28_4_ = buf._28_4_ & 0xffffff00;
                                buf._0_8_ = buf + 0x10;
                                bVar11 = UniValue::findKey(pUVar20,(string *)buf,&i_1);
                                if ((char *)buf._0_8_ != buf + 0x10) {
                                  operator_delete((void *)buf._0_8_,
                                                  CONCAT17(buf[0x17],
                                                           CONCAT25(buf._21_2_,
                                                                    CONCAT14(buf[0x14],buf._16_4_)))
                                                  + 1);
                                }
                                if (bVar11) {
                                  i_1 = (size_t)&local_3c8;
                                  local_3c8._M_allocated_capacity = 0x63536d6565646572;
                                  local_3c8._8_4_ = 0x74706972;
                                  local_3d0 = 0xc;
                                  local_3c8._12_4_ = local_3c8._12_4_ & 0xffffff00;
                                  pUVar20 = UniValue::operator[](pUVar20,(string *)&i_1);
                                  buf._0_4_ = pUVar20->typ;
                                  buf._8_8_ = buf + 0x18;
                                  pcVar38 = (pUVar20->val)._M_dataplus._M_p;
                                  std::__cxx11::string::_M_construct<char*>
                                            ((string *)(buf + 8),pcVar38,
                                             pcVar38 + (pUVar20->val)._M_string_length);
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)(buf + 0x28),&pUVar20->keys);
                                  std::vector<UniValue,_std::allocator<UniValue>_>::vector
                                            ((vector<UniValue,_std::allocator<UniValue>_> *)
                                             (buf + 0x40),&pUVar20->values);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)i_1 != &local_3c8) {
                                    operator_delete((void *)i_1,local_3c8._M_allocated_capacity + 1)
                                    ;
                                  }
                                  local_3c8._M_allocated_capacity = 0x63536d6565646572;
                                  local_3c8._8_4_ = 0x74706972;
                                  local_3d0 = 0xc;
                                  local_3c8._12_4_ = local_3c8._12_4_ & 0xffffff00;
                                  i_1 = (size_t)&local_3c8;
                                  ParseHexUV((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&i,(UniValue *)buf,(string *)&i_1);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)i_1 != &local_3c8) {
                                    operator_delete((void *)i_1,local_3c8._M_allocated_capacity + 1)
                                    ;
                                  }
                                  prevector<28U,_unsigned_char,_unsigned_int,_int>::
                                  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                             &i_1,(
                                                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  )i,local_3f0);
                                  FillableSigningProvider::AddCScript
                                            ((FillableSigningProvider *)&strHexTx,(CScript *)&i_1);
                                  if (0x1c < (uint)local_3c8._12_4_) {
                                    free((void *)i_1);
                                  }
                                  if (i != 0) {
                                    operator_delete((void *)i,local_3e8._M_allocated_capacity - i);
                                  }
                                  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                                            ((vector<UniValue,_std::allocator<UniValue>_> *)
                                             (buf + 0x40));
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)(buf + 0x28));
                                  if ((char *)buf._8_8_ != buf + 0x18) {
                                    operator_delete((void *)buf._8_8_,
                                                    CONCAT44(buf._28_4_,
                                                             CONCAT13(buf[0x1b],buf._24_3_)) + 1);
                                  }
                                }
                              }
                              else {
                                bVar11 = CScript::IsPayToWitnessScriptHash((CScript *)local_388);
                                if (bVar11) goto LAB_0011a03b;
                              }
                              if (0x1c < (uint)local_388._28_4_) {
                                free((void *)local_388._0_8_);
                              }
                              if (pkData.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                operator_delete(pkData.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)pkData.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                - (long)pkData.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                              }
                              std::
                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
                              ::~_Rb_tree(&types._M_t);
                              sVar43 = (size_t)((int)sVar43 + 1);
                              uVar29 = ((long)prevtxsObj.values.
                                              super__Vector_base<UniValue,_std::allocator<UniValue>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)prevtxsObj.values.
                                              super__Vector_base<UniValue,_std::allocator<UniValue>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                       0x2e8ba2e8ba2e8ba3;
                            } while (sVar43 <= uVar29 && uVar29 - sVar43 != 0);
                          }
                          if (mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                              .super__Vector_impl_data._M_finish !=
                              mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                              .super__Vector_impl_data._M_start) {
                            uVar35 = in_stack_ffffffffffffe9d4 & 0xffffff7f;
                            uVar29 = 0;
                            do {
                              input = mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar29;
                              txout = &CCoinsViewCache::AccessCoin
                                                 ((CCoinsViewCache *)&filename,&input->prevout)->out
                              ;
                              uVar33 = (uint)uVar29;
                              if (txout->nValue != -1) {
                                DataFromTransaction((SignatureData *)buf,&mergedTx,uVar33,txout);
                                if ((uVar35 != 3) ||
                                   (uVar24 = ((long)mergedTx.vout.
                                                                                                        
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)mergedTx.vout.
                                                                                                        
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                             -0x3333333333333333,
                                   uVar29 <= uVar24 && uVar24 - uVar29 != 0)) {
                                  in_R8 = (allocator_type *)(ulong)in_stack_ffffffffffffe9d4;
                                  MutableTransactionSignatureCreator::
                                  MutableTransactionSignatureCreator
                                            ((MutableTransactionSignatureCreator *)&types,&mergedTx,
                                             uVar33,&txout->nValue,in_stack_ffffffffffffe9d4);
                                  ProduceSignature((SigningProvider *)&strHexTx,
                                                   (BaseSignatureCreator *)&types,
                                                   &txout->scriptPubKey,(SignatureData *)buf);
                                }
                                if ((txout->nValue == 2100000000000000) &&
                                   (CONCAT44(buf._108_4_,buf._104_4_) !=
                                    CONCAT44(buf._116_4_,buf._112_4_))) {
                                  prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                                  uVar35 = (txout->scriptPubKey).super_CScriptBase._size;
                                  pbVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(ulong)uVar35;
                                  uVar33 = uVar35 - 0x1d;
                                  pCVar45 = (CScript *)
                                            (txout->scriptPubKey).super_CScriptBase._union.
                                            indirect_contents.indirect;
                                  if (uVar35 < 0x1d) {
                                    uVar33 = uVar35;
                                    pCVar45 = &txout->scriptPubKey;
                                  }
                                  s.m_size._0_4_ = uVar33;
                                  s.m_data = (uchar *)pCVar45;
                                  s.m_size._4_4_ = 0;
                                  HexStr_abi_cxx11_((string *)&out,s);
                                  tinyformat::format<std::__cxx11::string>
                                            ((string *)&types,
                                             (tinyformat *)
                                             "Missing amount for CTxOut with scriptPubKey=%s",
                                             (char *)&out,pbVar25);
                                  std::runtime_error::runtime_error(prVar28,(string *)&types);
                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                    __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                                std::runtime_error::~runtime_error);
                                  }
                                  goto LAB_0011db6a;
                                }
                                UpdateInput(input,(SignatureData *)buf);
                                SignatureData::~SignatureData((SignatureData *)buf);
                              }
                              uVar29 = (ulong)(uVar33 + 1);
                              uVar24 = ((long)mergedTx.vin.
                                              super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                        (long)mergedTx.vin.
                                              super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                              _M_impl.super__Vector_impl_data._M_start >> 3) *
                                       0x4ec4ec4ec4ec4ec5;
                            } while (uVar29 <= uVar24 && uVar24 - uVar29 != 0);
                          }
                          std::vector<CTxIn,_std::allocator<CTxIn>_>::operator=
                                    (&tx.vin,&mergedTx.vin);
                          std::vector<CTxOut,_std::allocator<CTxOut>_>::operator=
                                    (&tx.vout,&mergedTx.vout);
                          tx.version = mergedTx.version;
                          tx.nLockTime = mergedTx.nLockTime;
                          std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                                    (&prevtxsObj.values);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector(&prevtxsObj.keys);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)prevtxsObj.val._M_dataplus._M_p != &prevtxsObj.val.field_2) {
                            operator_delete(prevtxsObj.val._M_dataplus._M_p,
                                            CONCAT44(prevtxsObj.val.field_2._M_allocated_capacity.
                                                     _4_4_,prevtxsObj.val.field_2.
                                                           _M_allocated_capacity._0_4_) + 1);
                          }
                          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2b0);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector(&local_2c8);
                          if ((undefined1 *)valStr._M_string_length !=
                              (undefined1 *)((long)&valStr.field_2 + 8)) {
                            operator_delete((void *)valStr._M_string_length,
                                            CONCAT17(valStr.field_2._M_local_buf[0xf],
                                                     CONCAT25(valStr.field_2._13_2_,
                                                              CONCAT14(valStr.field_2._M_local_buf
                                                                       [0xc],valStr.field_2._8_4_)))
                                            + 1);
                          }
                          strHexTx._M_dataplus._M_p = (pointer)ppuVar47;
                          std::
                          _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                          ::~_Rb_tree(&local_260);
                          std::
                          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                          ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                                       *)&strHexTx._M_string_length);
                          filename._M_dataplus._M_p = (pointer)&PTR_GetCoin_003d8248;
                          std::
                          _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::~_Hashtable(&local_98);
                          if (local_d0 != '\0') {
                            (local_d8->second).m_prev = local_e0;
                            (local_e0->second).m_next = local_d8;
                            local_d0 = '\0';
                          }
                          if (0x1c < local_a4) {
                            free(local_c0.indirect_contents.indirect);
                            local_c0.indirect_contents.indirect = (char *)0x0;
                          }
                          PoolResource<144UL,_8UL>::~PoolResource
                                    ((PoolResource<144UL,_8UL> *)(local_1e0 + 0x10));
                          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txv.vout);
                          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&txv.vin);
                          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mergedTx.vout);
                          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mergedTx.vin);
                          goto LAB_001190f9;
                        }
                        prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  (prVar28,"prevtxs register variable must be set.");
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                      }
                      goto LAB_0011db6a;
                    }
                    iVar12 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             compare(&key,"load");
                    sVar40 = value._M_string_length;
                    _Var30 = value._M_dataplus;
                    if (iVar12 == 0) {
                      if (value._M_string_length == 0) {
LAB_0011bd81:
                        prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  (prVar28,"Register load requires NAME:FILENAME");
                        goto LAB_0011b555;
                      }
                      pvVar14 = memchr(value._M_dataplus._M_p,0x3a,value._M_string_length);
                      uVar29 = -(ulong)(pvVar14 == (void *)0x0) | (long)pvVar14 - (long)_Var30._M_p;
                      if ((uVar29 == sVar40 - 1) || (uVar29 + 1 < 2)) goto LAB_0011bd81;
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                (&strHexTx,&value,0,uVar29);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                (&filename,&value,uVar29 + 1,0xffffffffffffffff);
                      valStr._M_dataplus = filename._M_dataplus;
                      std::filesystem::__cxx11::path::
                      path<char_const*,std::filesystem::__cxx11::path>
                                ((path *)buf,(char **)&valStr,auto_format);
                      __stream = fsbridge::fopen(buf,"r");
                      std::filesystem::__cxx11::path::~path((path *)buf);
                      if (__stream == (FILE *)0x0) {
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)buf,"Cannot open file ",&filename);
                        prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar28,(string *)buf);
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                      }
                      else {
                        valStr._M_dataplus._M_p = (pointer)&valStr.field_2;
                        valStr._M_string_length._0_4_ = 0;
                        valStr._M_string_length._4_4_ = 0;
                        valStr.field_2._M_allocated_capacity._0_4_ =
                             valStr.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
                        while( true ) {
                          iVar12 = feof(__stream);
                          if (iVar12 != 0) break;
                          iVar12 = ferror(__stream);
                          if (iVar12 != 0) break;
                          sVar17 = fread(buf,1,0x1000,__stream);
                          if ((int)(uint)sVar17 < 1) break;
                          in_R8 = (allocator_type *)(ulong)((uint)sVar17 & 0x7fffffff);
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                    (&valStr,CONCAT44(valStr._M_string_length._4_4_,
                                                      (undefined4)valStr._M_string_length),0,buf,
                                     (size_type)in_R8);
                        }
                        iVar12 = ferror(__stream);
                        fclose(__stream);
                        if (iVar12 == 0) {
                          RegisterSetJson(&strHexTx,(string *)valStr._M_dataplus._M_p);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)valStr._M_dataplus._M_p != &valStr.field_2) {
                            operator_delete(valStr._M_dataplus._M_p,
                                            CONCAT44(valStr.field_2._M_allocated_capacity._4_4_,
                                                     valStr.field_2._M_allocated_capacity._0_4_) + 1
                                           );
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)filename._M_dataplus._M_p != &filename.field_2) {
                            uVar29 = CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                                              CONCAT24(filename.field_2._M_allocated_capacity._4_2_,
                                                       filename.field_2._M_allocated_capacity._0_4_)
                                             ) + 1;
                            _Var30._M_p = filename._M_dataplus._M_p;
                            goto LAB_00119363;
                          }
                          goto LAB_00119368;
                        }
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)buf,"Error reading file ",&filename);
                        prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar28,(string *)buf);
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                      }
                      goto LAB_0011db6a;
                    }
                    iVar12 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             compare(&key,"set");
                    sVar40 = value._M_string_length;
                    _Var30 = value._M_dataplus;
                    if (iVar12 != 0) {
                      prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar28,"unknown command");
LAB_0011b555:
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        __cxa_throw(prVar28,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      goto LAB_0011db6a;
                    }
                    if (value._M_string_length == 0) {
LAB_0011bbc6:
                      prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                (prVar28,"Register input requires NAME:VALUE");
                      goto LAB_0011b555;
                    }
                    pvVar14 = memchr(value._M_dataplus._M_p,0x3a,value._M_string_length);
                    uVar29 = -(ulong)(pvVar14 == (void *)0x0) | (long)pvVar14 - (long)_Var30._M_p;
                    if ((uVar29 == sVar40 - 1) || (uVar29 + 1 < 2)) goto LAB_0011bbc6;
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             buf,&value,0,uVar29);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::substr(&filename,&value,uVar29 + 1,0xffffffffffffffff);
                    RegisterSetJson((string *)buf,(string *)filename._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)filename._M_dataplus._M_p != &filename.field_2) {
                      operator_delete(filename._M_dataplus._M_p,
                                      CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                                               CONCAT24(filename.field_2._M_allocated_capacity._4_2_
                                                        ,filename.field_2._M_allocated_capacity.
                                                         _0_4_)) + 1);
                    }
                    if ((char *)buf._0_8_ == buf + 0x10) goto LAB_001190f9;
                    lVar44 = CONCAT17(buf[0x17],CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_)))
                    ;
                    _Var30._M_p = (pointer)buf._0_8_;
                  }
                  operator_delete(_Var30._M_p,lVar44 + 1);
                }
              }
            }
          }
        }
      }
LAB_001190f9:
      std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::~unique_ptr
                ((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)&local_15c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value._M_dataplus._M_p != &value.field_2) {
        operator_delete(value._M_dataplus._M_p,
                        CONCAT71(value.field_2._M_allocated_capacity._1_7_,
                                 value.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)key._M_dataplus._M_p != &key.field_2) {
        operator_delete(key._M_dataplus._M_p,
                        CONCAT71(key.field_2._M_allocated_capacity._1_7_,key.field_2._M_local_buf[0]
                                ) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)arg._M_dataplus._M_p != &arg.field_2) {
        operator_delete(arg._M_dataplus._M_p,arg.field_2._M_allocated_capacity + 1);
      }
      uVar39 = uVar39 + 1;
    } while (uVar39 != uVar34);
  }
  CTransaction::CTransaction((CTransaction *)buf,&tx);
  paVar32 = &filename.field_2;
  filename.field_2._M_allocated_capacity._0_4_ = 0x6f736a2d;
  filename.field_2._M_allocated_capacity._4_2_ = 0x6e;
  filename._M_string_length._0_4_ = 5;
  filename._M_string_length._4_4_ = 0;
  filename._M_dataplus._M_p = (pointer)paVar32;
  bVar11 = ArgsManager::GetBoolArg(&gArgs,&filename,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar32) {
    operator_delete(filename._M_dataplus._M_p,
                    CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(filename.field_2._M_allocated_capacity._4_2_,
                                      filename.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if (bVar11) {
    valStr._M_dataplus._M_p = (pointer)&valStr.field_2;
    puVar1 = (undefined1 *)((long)&filename.field_2 + 8);
    filename._M_dataplus._M_p._0_4_ = 1;
    filename.field_2._8_4_ = valStr.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    filename.field_2._12_4_ = valStr.field_2._M_allocated_capacity._4_4_;
    filename.field_2._M_allocated_capacity._0_4_ = 0;
    filename.field_2._M_allocated_capacity._4_2_ = 0;
    filename.field_2._M_allocated_capacity._6_2_ = 0;
    valStr._M_string_length._0_4_ = 0;
    valStr._M_string_length._4_4_ = 0;
    valStr.field_2._M_allocated_capacity._0_4_ =
         valStr.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    local_1e0._0_8_ = (pointer)0x0;
    local_1e0._8_8_ = (pointer)0x0;
    local_1e0._16_8_ = (pointer)0x0;
    avStack_1c8[0].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_1c8[0].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_1c8[0].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    strHexTx.field_2._M_allocated_capacity._0_4_ = 0;
    strHexTx.field_2._M_allocated_capacity._4_4_ = 0;
    strHexTx.field_2._8_4_ = 0;
    strHexTx.field_2._12_4_ = 0;
    strHexTx._M_dataplus._M_p = (pointer)0x0;
    strHexTx._M_string_length._0_4_ = 0;
    strHexTx._M_string_length._4_4_ = 0;
    filename._M_string_length = (size_type)puVar1;
    TxToUniv((CTransaction *)buf,(uint256 *)&strHexTx,(UniValue *)&filename,true,(CTxUndo *)0x0,
             SHOW_DETAILS);
    UniValue::write_abi_cxx11_(&prevtxsObj,(int)&filename,(void *)0x4,0);
    strHexTx._M_dataplus._M_p = (pointer)&strHexTx.field_2;
    strHexTx._M_string_length._0_4_ = 1;
    strHexTx.field_2._8_4_ = 0x11fff4;
    strHexTx.field_2._12_4_ = 0;
    strHexTx.field_2._M_allocated_capacity = (size_type)&prevtxsObj;
    tinyformat::detail::formatImpl
              ((ostream *)&std::cout,"%s\n",(FormatArg *)strHexTx._M_dataplus._M_p,1);
    if ((size_type *)prevtxsObj._0_8_ != &prevtxsObj.val._M_string_length) {
      operator_delete((void *)prevtxsObj._0_8_,prevtxsObj.val._M_string_length + 1);
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(avStack_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e0);
    sVar40 = filename._M_string_length;
    if ((undefined1 *)filename._M_string_length != puVar1) {
      lVar44 = CONCAT44(filename.field_2._12_4_,filename.field_2._8_4_);
LAB_0011a8c8:
      operator_delete((void *)filename._M_string_length,lVar44 + 1);
      filename._M_string_length = sVar40;
      sVar40 = filename._M_string_length;
    }
  }
  else {
    filename.field_2._M_allocated_capacity._0_4_ = 0x6978742d;
    filename.field_2._M_allocated_capacity._4_2_ = 100;
    filename._M_string_length._0_4_ = 5;
    filename._M_string_length._4_4_ = 0;
    filename._M_dataplus._M_p = (pointer)paVar32;
    bVar11 = ArgsManager::GetBoolArg(&gArgs,&filename,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename._M_dataplus._M_p != paVar32) {
      operator_delete(filename._M_dataplus._M_p,
                      CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(filename.field_2._M_allocated_capacity._4_2_,
                                        filename.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    if (bVar11) {
      base_blob<256u>::GetHex_abi_cxx11_(&valStr,buf + 0x39);
      strHexTx._M_dataplus._M_p = (pointer)&strHexTx.field_2;
      strHexTx._M_string_length._0_4_ = 1;
      strHexTx.field_2._8_4_ = 0x11fff4;
      strHexTx.field_2._12_4_ = 0;
      strHexTx.field_2._M_allocated_capacity = (size_type)&valStr;
      tinyformat::detail::formatImpl
                ((ostream *)&std::cout,"%s\n",(FormatArg *)strHexTx._M_dataplus._M_p,1);
    }
    else {
      EncodeHexTx_abi_cxx11_(&valStr,(CTransaction *)buf);
      strHexTx._M_dataplus._M_p = (pointer)&strHexTx.field_2;
      strHexTx._M_string_length._0_4_ = 1;
      strHexTx.field_2._8_4_ = 0x11fff4;
      strHexTx.field_2._12_4_ = 0;
      strHexTx.field_2._M_allocated_capacity = (size_type)&valStr;
      tinyformat::detail::formatImpl
                ((ostream *)&std::cout,"%s\n",(FormatArg *)strHexTx._M_dataplus._M_p,1);
    }
    sVar40 = CONCAT44(filename._M_string_length._4_4_,(undefined4)filename._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)valStr._M_dataplus._M_p != &valStr.field_2) {
      lVar44 = CONCAT44(valStr.field_2._M_allocated_capacity._4_4_,
                        valStr.field_2._M_allocated_capacity._0_4_);
      filename._M_string_length = (size_type)valStr._M_dataplus._M_p;
      goto LAB_0011a8c8;
    }
  }
  filename._M_string_length = sVar40;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(buf + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector((vector<CTxIn,_std::allocator<CTxIn>_> *)buf);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx.vin);
  iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     (&strPrint,"");
  if (iVar12 != 0) {
    filename._M_dataplus._M_p = (pointer)&filename.field_2;
    filename._M_string_length._0_4_ = 1;
    filename.field_2._M_allocated_capacity._0_4_ = SUB84(&strPrint,0);
    filename.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)&strPrint >> 0x20);
    filename.field_2._M_allocated_capacity._6_2_ = (undefined2)((ulong)&strPrint >> 0x30);
    filename.field_2._8_4_ = 0x11fff4;
    filename.field_2._12_4_ = 0;
    tinyformat::detail::formatImpl
              ((ostream *)&std::cout,"%s\n",(FormatArg *)filename._M_dataplus._M_p,1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strPrint._M_dataplus._M_p != &strPrint.field_2) {
    operator_delete(strPrint._M_dataplus._M_p,
                    CONCAT71(strPrint.field_2._M_allocated_capacity._1_7_,
                             strPrint.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return 0;
  }
LAB_0011db6a:
  __stack_chk_fail();
}

Assistant:

static int CommandLineRawTx(int argc, char* argv[])
{
    std::string strPrint;
    int nRet = 0;
    try {
        // Skip switches; Permit common stdin convention "-"
        while (argc > 1 && IsSwitchChar(argv[1][0]) &&
               (argv[1][1] != 0)) {
            argc--;
            argv++;
        }

        CMutableTransaction tx;
        int startArg;

        if (!fCreateBlank) {
            // require at least one param
            if (argc < 2)
                throw std::runtime_error("too few parameters");

            // param: hex-encoded bitcoin transaction
            std::string strHexTx(argv[1]);
            if (strHexTx == "-")                 // "-" implies standard input
                strHexTx = readStdin();

            if (!DecodeHexTx(tx, strHexTx, true))
                throw std::runtime_error("invalid transaction encoding");

            startArg = 2;
        } else
            startArg = 1;

        for (int i = startArg; i < argc; i++) {
            std::string arg = argv[i];
            std::string key, value;
            size_t eqpos = arg.find('=');
            if (eqpos == std::string::npos)
                key = arg;
            else {
                key = arg.substr(0, eqpos);
                value = arg.substr(eqpos + 1);
            }

            MutateTx(tx, key, value);
        }

        OutputTx(CTransaction(tx));
    }
    catch (const std::exception& e) {
        strPrint = std::string("error: ") + e.what();
        nRet = EXIT_FAILURE;
    }
    catch (...) {
        PrintExceptionContinue(nullptr, "CommandLineRawTx()");
        throw;
    }

    if (strPrint != "") {
        tfm::format(nRet == 0 ? std::cout : std::cerr, "%s\n", strPrint);
    }
    return nRet;
}